

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

bool embree::avx512::CurveNvIntersector1<8>::
     occluded_t<embree::avx512::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx512::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  Geometry *pGVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  byte bVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  RTCFilterFunctionN p_Var69;
  ulong uVar70;
  long lVar71;
  Geometry *geometry;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar76;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  long lVar72;
  ulong uVar73;
  byte bVar74;
  float fVar75;
  float fVar124;
  float fVar125;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar81 [16];
  float fVar126;
  float fVar128;
  float fVar129;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar127;
  float fVar130;
  float fVar131;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined4 uVar132;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined8 uVar138;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  float fVar142;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  float fVar148;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 in_ZMM4 [64];
  float fVar159;
  float fVar160;
  undefined1 auVar161 [32];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [64];
  undefined1 auVar173 [64];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  RTCFilterFunctionNArguments args;
  int local_574;
  long local_570;
  Precalculations *local_568;
  Primitive *local_560;
  Ray *local_558;
  RayQueryContext *local_550;
  undefined4 local_544;
  ulong local_540;
  float local_534;
  RTCFilterFunctionNArguments local_530;
  undefined8 local_500;
  undefined4 local_4f8;
  float local_4f4;
  undefined4 local_4f0;
  undefined4 local_4ec;
  undefined4 local_4e8;
  uint local_4e4;
  uint local_4e0;
  Geometry *local_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  ulong local_390;
  ulong local_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_310 [8];
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined4 local_220;
  int local_21c;
  undefined1 local_210 [16];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar66 = (ulong)(byte)prim[1];
  fVar159 = *(float *)(prim + uVar66 * 0x19 + 0x12);
  auVar139 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + uVar66 * 0x19 + 6));
  fVar142 = fVar159 * (ray->dir).field_0.m128[0];
  fVar148 = fVar159 * auVar139._0_4_;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar66 * 4 + 6);
  auVar94 = vpmovsxbd_avx2(auVar78);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar66 * 5 + 6);
  auVar90 = vpmovsxbd_avx2(auVar77);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar66 * 6 + 6);
  auVar91 = vpmovsxbd_avx2(auVar83);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar66 * 0xb + 6);
  auVar92 = vpmovsxbd_avx2(auVar82);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar66 * 0xc + 6);
  auVar95 = vpmovsxbd_avx2(auVar7);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar66 * 0xd + 6);
  auVar93 = vpmovsxbd_avx2(auVar8);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar66 * 0x12 + 6);
  auVar100 = vpmovsxbd_avx2(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar66 * 0x13 + 6);
  auVar88 = vpmovsxbd_avx2(auVar10);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar99 = vcvtdq2ps_avx(auVar88);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar66 * 0x14 + 6);
  auVar96 = vpmovsxbd_avx2(auVar11);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar168._4_4_ = fVar142;
  auVar168._0_4_ = fVar142;
  auVar168._8_4_ = fVar142;
  auVar168._12_4_ = fVar142;
  auVar168._16_4_ = fVar142;
  auVar168._20_4_ = fVar142;
  auVar168._24_4_ = fVar142;
  auVar168._28_4_ = fVar142;
  auVar84 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar89 = ZEXT1632(CONCAT412(fVar159 * (ray->dir).field_0.m128[3],
                               CONCAT48(fVar159 * (ray->dir).field_0.m128[2],
                                        CONCAT44(fVar159 * (ray->dir).field_0.m128[1],fVar142))));
  auVar85 = vpermps_avx512vl(auVar84,auVar89);
  auVar86 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar87 = vpermps_avx512vl(auVar86,auVar89);
  fVar142 = auVar87._0_4_;
  auVar172._0_4_ = fVar142 * auVar91._0_4_;
  fVar135 = auVar87._4_4_;
  auVar172._4_4_ = fVar135 * auVar91._4_4_;
  fVar136 = auVar87._8_4_;
  auVar172._8_4_ = fVar136 * auVar91._8_4_;
  fVar137 = auVar87._12_4_;
  auVar172._12_4_ = fVar137 * auVar91._12_4_;
  fVar160 = auVar87._16_4_;
  auVar172._16_4_ = fVar160 * auVar91._16_4_;
  fVar75 = auVar87._20_4_;
  auVar172._20_4_ = fVar75 * auVar91._20_4_;
  fVar76 = auVar87._24_4_;
  auVar172._28_36_ = in_ZMM4._28_36_;
  auVar172._24_4_ = fVar76 * auVar91._24_4_;
  auVar89._4_4_ = auVar93._4_4_ * fVar135;
  auVar89._0_4_ = auVar93._0_4_ * fVar142;
  auVar89._8_4_ = auVar93._8_4_ * fVar136;
  auVar89._12_4_ = auVar93._12_4_ * fVar137;
  auVar89._16_4_ = auVar93._16_4_ * fVar160;
  auVar89._20_4_ = auVar93._20_4_ * fVar75;
  auVar89._24_4_ = auVar93._24_4_ * fVar76;
  auVar89._28_4_ = auVar88._28_4_;
  auVar88._4_4_ = auVar96._4_4_ * fVar135;
  auVar88._0_4_ = auVar96._0_4_ * fVar142;
  auVar88._8_4_ = auVar96._8_4_ * fVar136;
  auVar88._12_4_ = auVar96._12_4_ * fVar137;
  auVar88._16_4_ = auVar96._16_4_ * fVar160;
  auVar88._20_4_ = auVar96._20_4_ * fVar75;
  auVar88._24_4_ = auVar96._24_4_ * fVar76;
  auVar88._28_4_ = auVar87._28_4_;
  auVar78 = vfmadd231ps_fma(auVar172._0_32_,auVar85,auVar90);
  auVar77 = vfmadd231ps_fma(auVar89,auVar85,auVar95);
  auVar83 = vfmadd231ps_fma(auVar88,auVar99,auVar85);
  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar168,auVar94);
  auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar168,auVar92);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar100,auVar168);
  auVar169._4_4_ = fVar148;
  auVar169._0_4_ = fVar148;
  auVar169._8_4_ = fVar148;
  auVar169._12_4_ = fVar148;
  auVar169._16_4_ = fVar148;
  auVar169._20_4_ = fVar148;
  auVar169._24_4_ = fVar148;
  auVar169._28_4_ = fVar148;
  auVar89 = ZEXT1632(CONCAT412(fVar159 * auVar139._12_4_,
                               CONCAT48(fVar159 * auVar139._8_4_,
                                        CONCAT44(fVar159 * auVar139._4_4_,fVar148))));
  auVar88 = vpermps_avx512vl(auVar84,auVar89);
  auVar89 = vpermps_avx512vl(auVar86,auVar89);
  fVar159 = auVar89._0_4_;
  fVar142 = auVar89._4_4_;
  auVar84._4_4_ = fVar142 * auVar91._4_4_;
  auVar84._0_4_ = fVar159 * auVar91._0_4_;
  fVar135 = auVar89._8_4_;
  auVar84._8_4_ = fVar135 * auVar91._8_4_;
  fVar136 = auVar89._12_4_;
  auVar84._12_4_ = fVar136 * auVar91._12_4_;
  fVar137 = auVar89._16_4_;
  auVar84._16_4_ = fVar137 * auVar91._16_4_;
  fVar160 = auVar89._20_4_;
  auVar84._20_4_ = fVar160 * auVar91._20_4_;
  fVar75 = auVar89._24_4_;
  auVar84._24_4_ = fVar75 * auVar91._24_4_;
  auVar84._28_4_ = auVar91._28_4_;
  auVar98._0_4_ = auVar93._0_4_ * fVar159;
  auVar98._4_4_ = auVar93._4_4_ * fVar142;
  auVar98._8_4_ = auVar93._8_4_ * fVar135;
  auVar98._12_4_ = auVar93._12_4_ * fVar136;
  auVar98._16_4_ = auVar93._16_4_ * fVar137;
  auVar98._20_4_ = auVar93._20_4_ * fVar160;
  auVar98._24_4_ = auVar93._24_4_ * fVar75;
  auVar98._28_4_ = 0;
  auVar93._4_4_ = auVar96._4_4_ * fVar142;
  auVar93._0_4_ = auVar96._0_4_ * fVar159;
  auVar93._8_4_ = auVar96._8_4_ * fVar135;
  auVar93._12_4_ = auVar96._12_4_ * fVar136;
  auVar93._16_4_ = auVar96._16_4_ * fVar137;
  auVar93._20_4_ = auVar96._20_4_ * fVar160;
  auVar93._24_4_ = auVar96._24_4_ * fVar75;
  auVar93._28_4_ = auVar89._28_4_;
  auVar82 = vfmadd231ps_fma(auVar84,auVar88,auVar90);
  auVar7 = vfmadd231ps_fma(auVar98,auVar88,auVar95);
  auVar8 = vfmadd231ps_fma(auVar93,auVar88,auVar99);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar169,auVar94);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar169,auVar92);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar169,auVar100);
  auVar163._8_4_ = 0x7fffffff;
  auVar163._0_8_ = 0x7fffffff7fffffff;
  auVar163._12_4_ = 0x7fffffff;
  auVar163._16_4_ = 0x7fffffff;
  auVar163._20_4_ = 0x7fffffff;
  auVar163._24_4_ = 0x7fffffff;
  auVar163._28_4_ = 0x7fffffff;
  auVar94 = vandps_avx(auVar163,ZEXT1632(auVar78));
  auVar113._8_4_ = 0x219392ef;
  auVar113._0_8_ = 0x219392ef219392ef;
  auVar113._12_4_ = 0x219392ef;
  auVar113._16_4_ = 0x219392ef;
  auVar113._20_4_ = 0x219392ef;
  auVar113._24_4_ = 0x219392ef;
  auVar113._28_4_ = 0x219392ef;
  uVar67 = vcmpps_avx512vl(auVar94,auVar113,1);
  bVar14 = (bool)((byte)uVar67 & 1);
  auVar85._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar78._0_4_;
  bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar85._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar78._4_4_;
  bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar85._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar78._8_4_;
  bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar85._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar78._12_4_;
  auVar85._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * 0x219392ef;
  auVar85._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * 0x219392ef;
  auVar85._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * 0x219392ef;
  auVar85._28_4_ = (uint)(byte)(uVar67 >> 7) * 0x219392ef;
  auVar94 = vandps_avx(auVar163,ZEXT1632(auVar77));
  uVar67 = vcmpps_avx512vl(auVar94,auVar113,1);
  bVar14 = (bool)((byte)uVar67 & 1);
  auVar86._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar77._0_4_;
  bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar77._4_4_;
  bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar77._8_4_;
  bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar77._12_4_;
  auVar86._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * 0x219392ef;
  auVar86._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * 0x219392ef;
  auVar86._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * 0x219392ef;
  auVar86._28_4_ = (uint)(byte)(uVar67 >> 7) * 0x219392ef;
  auVar94 = vandps_avx(auVar163,ZEXT1632(auVar83));
  uVar67 = vcmpps_avx512vl(auVar94,auVar113,1);
  bVar14 = (bool)((byte)uVar67 & 1);
  auVar94._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar83._0_4_;
  bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar83._4_4_;
  bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar83._8_4_;
  bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar83._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar67 >> 7) * 0x219392ef;
  auVar90 = vrcp14ps_avx512vl(auVar85);
  auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar92 = vfnmadd213ps_avx512vl(auVar85,auVar90,auVar91);
  auVar78 = vfmadd132ps_fma(auVar92,auVar90,auVar90);
  auVar90 = vrcp14ps_avx512vl(auVar86);
  auVar92 = vfnmadd213ps_avx512vl(auVar86,auVar90,auVar91);
  auVar77 = vfmadd132ps_fma(auVar92,auVar90,auVar90);
  auVar90 = vrcp14ps_avx512vl(auVar94);
  auVar91 = vfnmadd213ps_avx512vl(auVar94,auVar90,auVar91);
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 7 + 6));
  auVar83 = vfmadd132ps_fma(auVar91,auVar90,auVar90);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar82));
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 9 + 6));
  auVar100._4_4_ = auVar78._4_4_ * auVar94._4_4_;
  auVar100._0_4_ = auVar78._0_4_ * auVar94._0_4_;
  auVar100._8_4_ = auVar78._8_4_ * auVar94._8_4_;
  auVar100._12_4_ = auVar78._12_4_ * auVar94._12_4_;
  auVar100._16_4_ = auVar94._16_4_ * 0.0;
  auVar100._20_4_ = auVar94._20_4_ * 0.0;
  auVar100._24_4_ = auVar94._24_4_ * 0.0;
  auVar100._28_4_ = auVar94._28_4_;
  auVar94 = vcvtdq2ps_avx(auVar90);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar82));
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 0xe + 6));
  auVar112._0_4_ = auVar78._0_4_ * auVar94._0_4_;
  auVar112._4_4_ = auVar78._4_4_ * auVar94._4_4_;
  auVar112._8_4_ = auVar78._8_4_ * auVar94._8_4_;
  auVar112._12_4_ = auVar78._12_4_ * auVar94._12_4_;
  auVar112._16_4_ = auVar94._16_4_ * 0.0;
  auVar112._20_4_ = auVar94._20_4_ * 0.0;
  auVar112._24_4_ = auVar94._24_4_ * 0.0;
  auVar112._28_4_ = 0;
  auVar94 = vcvtdq2ps_avx(auVar90);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar7));
  auVar99._4_4_ = auVar77._4_4_ * auVar94._4_4_;
  auVar99._0_4_ = auVar77._0_4_ * auVar94._0_4_;
  auVar99._8_4_ = auVar77._8_4_ * auVar94._8_4_;
  auVar99._12_4_ = auVar77._12_4_ * auVar94._12_4_;
  auVar99._16_4_ = auVar94._16_4_ * 0.0;
  auVar99._20_4_ = auVar94._20_4_ * 0.0;
  auVar99._24_4_ = auVar94._24_4_ * 0.0;
  auVar99._28_4_ = auVar94._28_4_;
  auVar93 = vpbroadcastd_avx512vl();
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar7));
  auVar97._0_4_ = auVar77._0_4_ * auVar94._0_4_;
  auVar97._4_4_ = auVar77._4_4_ * auVar94._4_4_;
  auVar97._8_4_ = auVar77._8_4_ * auVar94._8_4_;
  auVar97._12_4_ = auVar77._12_4_ * auVar94._12_4_;
  auVar97._16_4_ = auVar94._16_4_ * 0.0;
  auVar97._20_4_ = auVar94._20_4_ * 0.0;
  auVar97._24_4_ = auVar94._24_4_ * 0.0;
  auVar97._28_4_ = 0;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 0x15 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar8));
  auVar96._4_4_ = auVar94._4_4_ * auVar83._4_4_;
  auVar96._0_4_ = auVar94._0_4_ * auVar83._0_4_;
  auVar96._8_4_ = auVar94._8_4_ * auVar83._8_4_;
  auVar96._12_4_ = auVar94._12_4_ * auVar83._12_4_;
  auVar96._16_4_ = auVar94._16_4_ * 0.0;
  auVar96._20_4_ = auVar94._20_4_ * 0.0;
  auVar96._24_4_ = auVar94._24_4_ * 0.0;
  auVar96._28_4_ = auVar94._28_4_;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 0x17 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar8));
  auVar87._0_4_ = auVar83._0_4_ * auVar94._0_4_;
  auVar87._4_4_ = auVar83._4_4_ * auVar94._4_4_;
  auVar87._8_4_ = auVar83._8_4_ * auVar94._8_4_;
  auVar87._12_4_ = auVar83._12_4_ * auVar94._12_4_;
  auVar87._16_4_ = auVar94._16_4_ * 0.0;
  auVar87._20_4_ = auVar94._20_4_ * 0.0;
  auVar87._24_4_ = auVar94._24_4_ * 0.0;
  auVar87._28_4_ = 0;
  auVar94 = vpminsd_avx2(auVar100,auVar112);
  auVar90 = vpminsd_avx2(auVar99,auVar97);
  auVar94 = vmaxps_avx(auVar94,auVar90);
  auVar90 = vpminsd_avx2(auVar96,auVar87);
  uVar132 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar91._4_4_ = uVar132;
  auVar91._0_4_ = uVar132;
  auVar91._8_4_ = uVar132;
  auVar91._12_4_ = uVar132;
  auVar91._16_4_ = uVar132;
  auVar91._20_4_ = uVar132;
  auVar91._24_4_ = uVar132;
  auVar91._28_4_ = uVar132;
  auVar90 = vmaxps_avx512vl(auVar90,auVar91);
  auVar94 = vmaxps_avx(auVar94,auVar90);
  auVar90._8_4_ = 0x3f7ffffa;
  auVar90._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar90._12_4_ = 0x3f7ffffa;
  auVar90._16_4_ = 0x3f7ffffa;
  auVar90._20_4_ = 0x3f7ffffa;
  auVar90._24_4_ = 0x3f7ffffa;
  auVar90._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar94,auVar90);
  auVar94 = vpmaxsd_avx2(auVar100,auVar112);
  auVar90 = vpmaxsd_avx2(auVar99,auVar97);
  auVar94 = vminps_avx(auVar94,auVar90);
  auVar90 = vpmaxsd_avx2(auVar96,auVar87);
  fVar159 = ray->tfar;
  auVar92._4_4_ = fVar159;
  auVar92._0_4_ = fVar159;
  auVar92._8_4_ = fVar159;
  auVar92._12_4_ = fVar159;
  auVar92._16_4_ = fVar159;
  auVar92._20_4_ = fVar159;
  auVar92._24_4_ = fVar159;
  auVar92._28_4_ = fVar159;
  auVar90 = vminps_avx512vl(auVar90,auVar92);
  auVar94 = vminps_avx(auVar94,auVar90);
  auVar95._8_4_ = 0x3f800003;
  auVar95._0_8_ = 0x3f8000033f800003;
  auVar95._12_4_ = 0x3f800003;
  auVar95._16_4_ = 0x3f800003;
  auVar95._20_4_ = 0x3f800003;
  auVar95._24_4_ = 0x3f800003;
  auVar95._28_4_ = 0x3f800003;
  auVar94 = vmulps_avx512vl(auVar94,auVar95);
  uVar138 = vcmpps_avx512vl(local_80,auVar94,2);
  uVar20 = vpcmpgtd_avx512vl(auVar93,_DAT_01fb4ba0);
  local_388 = (ulong)(byte)((byte)uVar138 & (byte)uVar20);
  local_550 = context;
  local_558 = ray;
  local_568 = pre;
  local_560 = prim;
  while (local_388 != 0) {
    lVar71 = 0;
    for (uVar67 = local_388; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
      lVar71 = lVar71 + 1;
    }
    uVar73 = local_388 - 1 & local_388;
    local_544 = *(undefined4 *)(local_560 + lVar71 * 4 + 6);
    uVar67 = (ulong)(uint)((int)lVar71 << 6);
    local_540 = (ulong)*(uint *)(local_560 + 2);
    pGVar13 = (local_550->scene->geometries).items[*(uint *)(local_560 + 2)].ptr;
    local_430 = *(undefined1 (*) [16])(prim + uVar67 + uVar66 * 0x19 + 0x16);
    if (uVar73 != 0) {
      uVar70 = uVar73 - 1 & uVar73;
      for (uVar68 = uVar73; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
      }
      if (uVar70 != 0) {
        for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
        }
      }
    }
    local_440 = *(undefined1 (*) [16])(prim + uVar67 + uVar66 * 0x19 + 0x26);
    local_450 = *(undefined1 (*) [16])(prim + uVar67 + uVar66 * 0x19 + 0x36);
    _local_310 = *(undefined1 (*) [16])(prim + uVar67 + uVar66 * 0x19 + 0x46);
    iVar12 = (int)pGVar13[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar4 = (local_558->org).field_0;
    auVar77 = vsubps_avx(local_430,(undefined1  [16])aVar4);
    uVar132 = auVar77._0_4_;
    auVar139._4_4_ = uVar132;
    auVar139._0_4_ = uVar132;
    auVar139._8_4_ = uVar132;
    auVar139._12_4_ = uVar132;
    auVar78 = vshufps_avx(auVar77,auVar77,0x55);
    aVar5 = (local_568->ray_space).vx.field_0;
    aVar6 = (local_568->ray_space).vy.field_0;
    fVar159 = (local_568->ray_space).vz.field_0.m128[0];
    fVar142 = (local_568->ray_space).vz.field_0.m128[1];
    fVar135 = (local_568->ray_space).vz.field_0.m128[2];
    fVar136 = (local_568->ray_space).vz.field_0.m128[3];
    auVar77 = vshufps_avx(auVar77,auVar77,0xaa);
    auVar162._0_4_ = auVar77._0_4_ * fVar159;
    auVar162._4_4_ = auVar77._4_4_ * fVar142;
    auVar162._8_4_ = auVar77._8_4_ * fVar135;
    auVar162._12_4_ = auVar77._12_4_ * fVar136;
    auVar78 = vfmadd231ps_fma(auVar162,(undefined1  [16])aVar6,auVar78);
    auVar83 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar5,auVar139);
    auVar77 = vsubps_avx(local_440,(undefined1  [16])aVar4);
    uVar132 = auVar77._0_4_;
    auVar79._4_4_ = uVar132;
    auVar79._0_4_ = uVar132;
    auVar79._8_4_ = uVar132;
    auVar79._12_4_ = uVar132;
    auVar78 = vshufps_avx(auVar77,auVar77,0x55);
    auVar77 = vshufps_avx(auVar77,auVar77,0xaa);
    auVar164._0_4_ = auVar77._0_4_ * fVar159;
    auVar164._4_4_ = auVar77._4_4_ * fVar142;
    auVar164._8_4_ = auVar77._8_4_ * fVar135;
    auVar164._12_4_ = auVar77._12_4_ * fVar136;
    auVar78 = vfmadd231ps_fma(auVar164,(undefined1  [16])aVar6,auVar78);
    auVar82 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar5,auVar79);
    auVar77 = vsubps_avx512vl(local_450,(undefined1  [16])aVar4);
    uVar132 = auVar77._0_4_;
    auVar80._4_4_ = uVar132;
    auVar80._0_4_ = uVar132;
    auVar80._8_4_ = uVar132;
    auVar80._12_4_ = uVar132;
    auVar78 = vshufps_avx(auVar77,auVar77,0x55);
    auVar77 = vshufps_avx(auVar77,auVar77,0xaa);
    auVar81._0_4_ = auVar77._0_4_ * fVar159;
    auVar81._4_4_ = auVar77._4_4_ * fVar142;
    auVar81._8_4_ = auVar77._8_4_ * fVar135;
    auVar81._12_4_ = auVar77._12_4_ * fVar136;
    auVar78 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar6,auVar78);
    auVar7 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar5,auVar80);
    local_3e0 = ZEXT1632((undefined1  [16])aVar4);
    auVar77 = vsubps_avx512vl(_local_310,(undefined1  [16])aVar4);
    uVar132 = auVar77._0_4_;
    auVar140._4_4_ = uVar132;
    auVar140._0_4_ = uVar132;
    auVar140._8_4_ = uVar132;
    auVar140._12_4_ = uVar132;
    auVar78 = vshufps_avx(auVar77,auVar77,0x55);
    auVar77 = vshufps_avx(auVar77,auVar77,0xaa);
    auVar166._0_4_ = auVar77._0_4_ * fVar159;
    auVar166._4_4_ = auVar77._4_4_ * fVar142;
    auVar166._8_4_ = auVar77._8_4_ * fVar135;
    auVar166._12_4_ = auVar77._12_4_ * fVar136;
    auVar78 = vfmadd231ps_fma(auVar166,(undefined1  [16])aVar6,auVar78);
    auVar8 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar5,auVar140);
    local_570 = (long)iVar12;
    lVar71 = local_570 * 0x44;
    auVar94 = *(undefined1 (*) [32])(bspline_basis0 + lVar71);
    local_340 = vbroadcastss_avx512vl(auVar83);
    auVar133._8_4_ = 1;
    auVar133._0_8_ = 0x100000001;
    auVar133._12_4_ = 1;
    auVar133._16_4_ = 1;
    auVar133._20_4_ = 1;
    auVar133._24_4_ = 1;
    auVar133._28_4_ = 1;
    local_360 = vpermps_avx2(auVar133,ZEXT1632(auVar83));
    auVar90 = *(undefined1 (*) [32])(bspline_basis0 + lVar71 + 0x484);
    uVar132 = auVar82._0_4_;
    local_380._4_4_ = uVar132;
    local_380._0_4_ = uVar132;
    local_380._8_4_ = uVar132;
    local_380._12_4_ = uVar132;
    local_380._16_4_ = uVar132;
    local_380._20_4_ = uVar132;
    local_380._24_4_ = uVar132;
    local_380._28_4_ = uVar132;
    auVar91 = *(undefined1 (*) [32])(bspline_basis0 + lVar71 + 0x908);
    local_400 = vpermps_avx2(auVar133,ZEXT1632(auVar82));
    local_480 = vbroadcastss_avx512vl(auVar7);
    local_4a0 = vpermps_avx512vl(auVar133,ZEXT1632(auVar7));
    auVar92 = *(undefined1 (*) [32])(bspline_basis0 + lVar71 + 0xd8c);
    fVar159 = auVar8._0_4_;
    local_420._4_4_ = fVar159;
    local_420._0_4_ = fVar159;
    local_420._8_4_ = fVar159;
    local_420._12_4_ = fVar159;
    local_420._16_4_ = fVar159;
    local_420._20_4_ = fVar159;
    local_420._24_4_ = fVar159;
    local_420._28_4_ = fVar159;
    local_4c0 = vpermps_avx512vl(auVar133,ZEXT1632(auVar8));
    auVar95 = vmulps_avx512vl(local_420,auVar92);
    auVar93 = vmulps_avx512vl(local_4c0,auVar92);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar91,local_480);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar91,local_4a0);
    auVar78 = vfmadd231ps_fma(auVar95,auVar90,local_380);
    auVar77 = vfmadd231ps_fma(auVar93,auVar90,local_400);
    auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar78),auVar94,local_340);
    auVar95 = *(undefined1 (*) [32])(bspline_basis1 + lVar71);
    auVar93 = *(undefined1 (*) [32])(bspline_basis1 + lVar71 + 0x484);
    auVar88 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar94,local_360);
    auVar100 = *(undefined1 (*) [32])(bspline_basis1 + lVar71 + 0x908);
    auVar99 = *(undefined1 (*) [32])(bspline_basis1 + lVar71 + 0xd8c);
    auVar89 = vmulps_avx512vl(local_420,auVar99);
    auVar84 = vmulps_avx512vl(local_4c0,auVar99);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar100,local_480);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar100,local_4a0);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar93,local_380);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar93,local_400);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar95,local_340);
    auVar9 = vfmadd231ps_fma(auVar84,auVar95,local_360);
    auVar84 = vsubps_avx512vl(auVar89,auVar96);
    auVar85 = vsubps_avx512vl(ZEXT1632(auVar9),auVar88);
    auVar86 = vmulps_avx512vl(auVar88,auVar84);
    auVar87 = vmulps_avx512vl(auVar96,auVar85);
    auVar86 = vsubps_avx512vl(auVar86,auVar87);
    auVar78 = vshufps_avx(local_430,local_430,0xff);
    uVar138 = auVar78._0_8_;
    local_a0._8_8_ = uVar138;
    local_a0._0_8_ = uVar138;
    local_a0._16_8_ = uVar138;
    local_a0._24_8_ = uVar138;
    auVar78 = vshufps_avx(local_440,local_440,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar78);
    auVar78 = vshufps_avx512vl(local_450,local_450,0xff);
    local_e0 = vbroadcastsd_avx512vl(auVar78);
    auVar78 = vshufps_avx512vl(_local_310,_local_310,0xff);
    uVar138 = auVar78._0_8_;
    register0x000012c8 = uVar138;
    local_100 = uVar138;
    register0x000012d0 = uVar138;
    register0x000012d8 = uVar138;
    auVar87 = vmulps_avx512vl(_local_100,auVar92);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar91,local_e0);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar90,local_c0);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar94,local_a0);
    auVar97 = vmulps_avx512vl(_local_100,auVar99);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar100,local_e0);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,local_c0);
    auVar10 = vfmadd231ps_fma(auVar97,auVar95,local_a0);
    auVar97 = vmulps_avx512vl(auVar85,auVar85);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar84,auVar84);
    auVar98 = vmaxps_avx512vl(auVar87,ZEXT1632(auVar10));
    auVar98 = vmulps_avx512vl(auVar98,auVar98);
    auVar97 = vmulps_avx512vl(auVar98,auVar97);
    auVar86 = vmulps_avx512vl(auVar86,auVar86);
    uVar138 = vcmpps_avx512vl(auVar86,auVar97,2);
    auVar78 = vblendps_avx(auVar83,local_430,8);
    auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar77 = vandps_avx512vl(auVar78,auVar79);
    auVar139 = local_440;
    auVar78 = vblendps_avx(auVar82,local_440,8);
    auVar78 = vandps_avx512vl(auVar78,auVar79);
    auVar77 = vmaxps_avx(auVar77,auVar78);
    auVar11 = local_450;
    auVar78 = vblendps_avx(auVar7,local_450,8);
    auVar80 = vandps_avx512vl(auVar78,auVar79);
    auVar78 = vblendps_avx(auVar8,_local_310,8);
    auVar78 = vandps_avx512vl(auVar78,auVar79);
    auVar78 = vmaxps_avx(auVar80,auVar78);
    auVar78 = vmaxps_avx(auVar77,auVar78);
    auVar77 = vmovshdup_avx(auVar78);
    auVar77 = vmaxss_avx(auVar77,auVar78);
    auVar78 = vshufpd_avx(auVar78,auVar78,1);
    auVar78 = vmaxss_avx(auVar78,auVar77);
    _local_300 = vcvtsi2ss_avx512f(_local_310,iVar12);
    auVar167._0_4_ = local_300._0_4_;
    auVar167._4_4_ = auVar167._0_4_;
    auVar167._8_4_ = auVar167._0_4_;
    auVar167._12_4_ = auVar167._0_4_;
    auVar167._16_4_ = auVar167._0_4_;
    auVar167._20_4_ = auVar167._0_4_;
    auVar167._24_4_ = auVar167._0_4_;
    auVar167._28_4_ = auVar167._0_4_;
    uVar20 = vcmpps_avx512vl(auVar167,_DAT_01f7b060,0xe);
    bVar74 = (byte)uVar138 & (byte)uVar20;
    auVar147._8_4_ = 2;
    auVar147._0_8_ = 0x200000002;
    auVar147._12_4_ = 2;
    auVar147._16_4_ = 2;
    auVar147._20_4_ = 2;
    auVar147._24_4_ = 2;
    auVar147._28_4_ = 2;
    local_120 = vpermps_avx512vl(auVar147,ZEXT1632(auVar83));
    local_140 = vpermps_avx512vl(auVar147,ZEXT1632(auVar82));
    local_160 = vpermps_avx512vl(auVar147,ZEXT1632(auVar7));
    local_3c0 = vpermps_avx2(auVar147,ZEXT1632(auVar8));
    auVar77 = auVar99._0_16_;
    auVar78 = ZEXT416((uint)(auVar78._0_4_ * 4.7683716e-07));
    if (bVar74 == 0) {
      uVar67 = 0;
      auVar77 = vxorps_avx512vl(auVar77,auVar77);
      auVar173 = ZEXT1664(auVar77);
      auVar176 = ZEXT3264(local_340);
      auVar174 = ZEXT3264(local_360);
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar180 = ZEXT3264(auVar94);
      auVar175 = ZEXT3264(local_380);
      auVar172 = ZEXT3264(local_400);
      auVar181 = ZEXT3264(local_480);
      auVar177 = ZEXT3264(local_4a0);
      auVar178 = ZEXT3264(local_420);
      auVar179 = ZEXT3264(local_4c0);
      local_450 = auVar11;
      local_440 = auVar139;
    }
    else {
      auVar99 = vmulps_avx512vl(local_3c0,auVar99);
      auVar100 = vfmadd213ps_avx512vl(auVar100,local_160,auVar99);
      auVar93 = vfmadd213ps_avx512vl(auVar93,local_140,auVar100);
      auVar93 = vfmadd213ps_avx512vl(auVar95,local_120,auVar93);
      auVar92 = vmulps_avx512vl(local_3c0,auVar92);
      auVar91 = vfmadd213ps_avx512vl(auVar91,local_160,auVar92);
      auVar100 = vfmadd213ps_avx512vl(auVar90,local_140,auVar91);
      auVar90 = *(undefined1 (*) [32])(bspline_basis0 + lVar71 + 0x1210);
      auVar91 = *(undefined1 (*) [32])(bspline_basis0 + lVar71 + 0x1694);
      auVar92 = *(undefined1 (*) [32])(bspline_basis0 + lVar71 + 0x1b18);
      auVar95 = *(undefined1 (*) [32])(bspline_basis0 + lVar71 + 0x1f9c);
      auVar100 = vfmadd213ps_avx512vl(auVar94,local_120,auVar100);
      auVar94 = vmulps_avx512vl(local_420,auVar95);
      auVar99 = vmulps_avx512vl(local_4c0,auVar95);
      auVar95 = vmulps_avx512vl(local_3c0,auVar95);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar92,local_480);
      auVar177 = ZEXT3264(local_4a0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar92,local_4a0);
      auVar92 = vfmadd231ps_avx512vl(auVar95,local_160,auVar92);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar91,local_380);
      auVar95 = vfmadd231ps_avx512vl(auVar99,auVar91,local_400);
      auVar99 = vfmadd231ps_avx512vl(auVar92,local_140,auVar91);
      auVar83 = vfmadd231ps_fma(auVar94,auVar90,local_340);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar90,local_360);
      auVar94 = *(undefined1 (*) [32])(bspline_basis1 + lVar71 + 0x1210);
      auVar91 = *(undefined1 (*) [32])(bspline_basis1 + lVar71 + 0x1b18);
      auVar92 = *(undefined1 (*) [32])(bspline_basis1 + lVar71 + 0x1f9c);
      auVar99 = vfmadd231ps_avx512vl(auVar99,local_120,auVar90);
      auVar30._4_4_ = fVar159 * auVar92._4_4_;
      auVar30._0_4_ = fVar159 * auVar92._0_4_;
      auVar30._8_4_ = fVar159 * auVar92._8_4_;
      auVar30._12_4_ = fVar159 * auVar92._12_4_;
      auVar30._16_4_ = fVar159 * auVar92._16_4_;
      auVar30._20_4_ = fVar159 * auVar92._20_4_;
      auVar30._24_4_ = fVar159 * auVar92._24_4_;
      auVar30._28_4_ = auVar90._28_4_;
      auVar178 = ZEXT3264(local_420);
      auVar90 = vmulps_avx512vl(local_4c0,auVar92);
      auVar92 = vmulps_avx512vl(local_3c0,auVar92);
      auVar86 = vfmadd231ps_avx512vl(auVar30,auVar91,local_480);
      auVar97 = vfmadd231ps_avx512vl(auVar90,auVar91,local_4a0);
      auVar91 = vfmadd231ps_avx512vl(auVar92,local_160,auVar91);
      auVar90 = *(undefined1 (*) [32])(bspline_basis1 + lVar71 + 0x1694);
      auVar92 = vfmadd231ps_avx512vl(auVar86,auVar90,local_380);
      auVar86 = vfmadd231ps_avx512vl(auVar97,auVar90,local_400);
      auVar90 = vfmadd231ps_avx512vl(auVar91,local_140,auVar90);
      auVar82 = vfmadd231ps_fma(auVar92,auVar94,local_340);
      auVar91 = vfmadd231ps_avx512vl(auVar86,auVar94,local_360);
      auVar92 = vfmadd231ps_avx512vl(auVar90,local_120,auVar94);
      auVar170._8_4_ = 0x7fffffff;
      auVar170._0_8_ = 0x7fffffff7fffffff;
      auVar170._12_4_ = 0x7fffffff;
      auVar170._16_4_ = 0x7fffffff;
      auVar170._20_4_ = 0x7fffffff;
      auVar170._24_4_ = 0x7fffffff;
      auVar170._28_4_ = 0x7fffffff;
      auVar94 = vandps_avx(ZEXT1632(auVar83),auVar170);
      auVar90 = vandps_avx(auVar95,auVar170);
      auVar90 = vmaxps_avx(auVar94,auVar90);
      auVar94 = vandps_avx(auVar99,auVar170);
      auVar94 = vmaxps_avx(auVar90,auVar94);
      auVar99 = vbroadcastss_avx512vl(auVar78);
      uVar67 = vcmpps_avx512vl(auVar94,auVar99,1);
      bVar14 = (bool)((byte)uVar67 & 1);
      auVar101._0_4_ = (float)((uint)bVar14 * auVar84._0_4_ | (uint)!bVar14 * auVar83._0_4_);
      bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar101._4_4_ = (float)((uint)bVar14 * auVar84._4_4_ | (uint)!bVar14 * auVar83._4_4_);
      bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar101._8_4_ = (float)((uint)bVar14 * auVar84._8_4_ | (uint)!bVar14 * auVar83._8_4_);
      bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar101._12_4_ = (float)((uint)bVar14 * auVar84._12_4_ | (uint)!bVar14 * auVar83._12_4_);
      fVar142 = (float)((uint)((byte)(uVar67 >> 4) & 1) * auVar84._16_4_);
      auVar101._16_4_ = fVar142;
      fVar159 = (float)((uint)((byte)(uVar67 >> 5) & 1) * auVar84._20_4_);
      auVar101._20_4_ = fVar159;
      fVar135 = (float)((uint)((byte)(uVar67 >> 6) & 1) * auVar84._24_4_);
      auVar101._24_4_ = fVar135;
      uVar1 = (uint)(byte)(uVar67 >> 7) * auVar84._28_4_;
      auVar101._28_4_ = uVar1;
      bVar14 = (bool)((byte)uVar67 & 1);
      auVar102._0_4_ = (float)((uint)bVar14 * auVar85._0_4_ | (uint)!bVar14 * auVar95._0_4_);
      bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar102._4_4_ = (float)((uint)bVar14 * auVar85._4_4_ | (uint)!bVar14 * auVar95._4_4_);
      bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar102._8_4_ = (float)((uint)bVar14 * auVar85._8_4_ | (uint)!bVar14 * auVar95._8_4_);
      bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar102._12_4_ = (float)((uint)bVar14 * auVar85._12_4_ | (uint)!bVar14 * auVar95._12_4_);
      bVar14 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar102._16_4_ = (float)((uint)bVar14 * auVar85._16_4_ | (uint)!bVar14 * auVar95._16_4_);
      bVar14 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar102._20_4_ = (float)((uint)bVar14 * auVar85._20_4_ | (uint)!bVar14 * auVar95._20_4_);
      bVar14 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar102._24_4_ = (float)((uint)bVar14 * auVar85._24_4_ | (uint)!bVar14 * auVar95._24_4_);
      bVar14 = SUB81(uVar67 >> 7,0);
      auVar102._28_4_ = (uint)bVar14 * auVar85._28_4_ | (uint)!bVar14 * auVar95._28_4_;
      auVar94 = vandps_avx(auVar170,ZEXT1632(auVar82));
      auVar90 = vandps_avx(auVar91,auVar170);
      auVar90 = vmaxps_avx(auVar94,auVar90);
      auVar94 = vandps_avx(auVar92,auVar170);
      auVar94 = vmaxps_avx(auVar90,auVar94);
      uVar67 = vcmpps_avx512vl(auVar94,auVar99,1);
      bVar14 = (bool)((byte)uVar67 & 1);
      auVar103._0_4_ = (float)((uint)bVar14 * auVar84._0_4_ | (uint)!bVar14 * auVar82._0_4_);
      bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar103._4_4_ = (float)((uint)bVar14 * auVar84._4_4_ | (uint)!bVar14 * auVar82._4_4_);
      bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar103._8_4_ = (float)((uint)bVar14 * auVar84._8_4_ | (uint)!bVar14 * auVar82._8_4_);
      bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar103._12_4_ = (float)((uint)bVar14 * auVar84._12_4_ | (uint)!bVar14 * auVar82._12_4_);
      fVar136 = (float)((uint)((byte)(uVar67 >> 4) & 1) * auVar84._16_4_);
      auVar103._16_4_ = fVar136;
      fVar137 = (float)((uint)((byte)(uVar67 >> 5) & 1) * auVar84._20_4_);
      auVar103._20_4_ = fVar137;
      fVar160 = (float)((uint)((byte)(uVar67 >> 6) & 1) * auVar84._24_4_);
      auVar103._24_4_ = fVar160;
      auVar103._28_4_ = (uint)(byte)(uVar67 >> 7) * auVar84._28_4_;
      bVar14 = (bool)((byte)uVar67 & 1);
      auVar104._0_4_ = (float)((uint)bVar14 * auVar85._0_4_ | (uint)!bVar14 * auVar91._0_4_);
      bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar104._4_4_ = (float)((uint)bVar14 * auVar85._4_4_ | (uint)!bVar14 * auVar91._4_4_);
      bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar104._8_4_ = (float)((uint)bVar14 * auVar85._8_4_ | (uint)!bVar14 * auVar91._8_4_);
      bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar104._12_4_ = (float)((uint)bVar14 * auVar85._12_4_ | (uint)!bVar14 * auVar91._12_4_);
      bVar14 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar104._16_4_ = (float)((uint)bVar14 * auVar85._16_4_ | (uint)!bVar14 * auVar91._16_4_);
      bVar14 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar104._20_4_ = (float)((uint)bVar14 * auVar85._20_4_ | (uint)!bVar14 * auVar91._20_4_);
      bVar14 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar104._24_4_ = (float)((uint)bVar14 * auVar85._24_4_ | (uint)!bVar14 * auVar91._24_4_);
      bVar14 = SUB81(uVar67 >> 7,0);
      auVar104._28_4_ = (uint)bVar14 * auVar85._28_4_ | (uint)!bVar14 * auVar91._28_4_;
      auVar81 = vxorps_avx512vl(auVar77,auVar77);
      auVar173 = ZEXT1664(auVar81);
      auVar94 = vfmadd213ps_avx512vl(auVar101,auVar101,ZEXT1632(auVar81));
      auVar77 = vfmadd231ps_fma(auVar94,auVar102,auVar102);
      auVar94 = vrsqrt14ps_avx512vl(ZEXT1632(auVar77));
      fVar75 = auVar94._0_4_;
      fVar76 = auVar94._4_4_;
      fVar148 = auVar94._8_4_;
      fVar124 = auVar94._12_4_;
      fVar125 = auVar94._16_4_;
      fVar126 = auVar94._20_4_;
      fVar128 = auVar94._24_4_;
      auVar31._4_4_ = fVar76 * fVar76 * fVar76 * auVar77._4_4_ * -0.5;
      auVar31._0_4_ = fVar75 * fVar75 * fVar75 * auVar77._0_4_ * -0.5;
      auVar31._8_4_ = fVar148 * fVar148 * fVar148 * auVar77._8_4_ * -0.5;
      auVar31._12_4_ = fVar124 * fVar124 * fVar124 * auVar77._12_4_ * -0.5;
      auVar31._16_4_ = fVar125 * fVar125 * fVar125 * -0.0;
      auVar31._20_4_ = fVar126 * fVar126 * fVar126 * -0.0;
      auVar31._24_4_ = fVar128 * fVar128 * fVar128 * -0.0;
      auVar31._28_4_ = 0;
      auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar91 = vfmadd231ps_avx512vl(auVar31,auVar90,auVar94);
      auVar32._4_4_ = auVar102._4_4_ * auVar91._4_4_;
      auVar32._0_4_ = auVar102._0_4_ * auVar91._0_4_;
      auVar32._8_4_ = auVar102._8_4_ * auVar91._8_4_;
      auVar32._12_4_ = auVar102._12_4_ * auVar91._12_4_;
      auVar32._16_4_ = auVar102._16_4_ * auVar91._16_4_;
      auVar32._20_4_ = auVar102._20_4_ * auVar91._20_4_;
      auVar32._24_4_ = auVar102._24_4_ * auVar91._24_4_;
      auVar32._28_4_ = auVar94._28_4_;
      auVar33._4_4_ = auVar91._4_4_ * -auVar101._4_4_;
      auVar33._0_4_ = auVar91._0_4_ * -auVar101._0_4_;
      auVar33._8_4_ = auVar91._8_4_ * -auVar101._8_4_;
      auVar33._12_4_ = auVar91._12_4_ * -auVar101._12_4_;
      auVar33._16_4_ = auVar91._16_4_ * -fVar142;
      auVar33._20_4_ = auVar91._20_4_ * -fVar159;
      auVar33._24_4_ = auVar91._24_4_ * -fVar135;
      auVar33._28_4_ = uVar1 ^ 0x80000000;
      auVar94 = vmulps_avx512vl(auVar91,ZEXT1632(auVar81));
      auVar84 = ZEXT1632(auVar81);
      auVar92 = vfmadd213ps_avx512vl(auVar103,auVar103,auVar84);
      auVar77 = vfmadd231ps_fma(auVar92,auVar104,auVar104);
      auVar92 = vrsqrt14ps_avx512vl(ZEXT1632(auVar77));
      fVar159 = auVar92._0_4_;
      fVar142 = auVar92._4_4_;
      fVar135 = auVar92._8_4_;
      fVar75 = auVar92._12_4_;
      fVar76 = auVar92._16_4_;
      fVar148 = auVar92._20_4_;
      fVar124 = auVar92._24_4_;
      auVar34._4_4_ = fVar142 * fVar142 * fVar142 * auVar77._4_4_ * -0.5;
      auVar34._0_4_ = fVar159 * fVar159 * fVar159 * auVar77._0_4_ * -0.5;
      auVar34._8_4_ = fVar135 * fVar135 * fVar135 * auVar77._8_4_ * -0.5;
      auVar34._12_4_ = fVar75 * fVar75 * fVar75 * auVar77._12_4_ * -0.5;
      auVar34._16_4_ = fVar76 * fVar76 * fVar76 * -0.0;
      auVar34._20_4_ = fVar148 * fVar148 * fVar148 * -0.0;
      auVar34._24_4_ = fVar124 * fVar124 * fVar124 * -0.0;
      auVar34._28_4_ = 0;
      auVar90 = vfmadd231ps_avx512vl(auVar34,auVar90,auVar92);
      auVar35._4_4_ = auVar104._4_4_ * auVar90._4_4_;
      auVar35._0_4_ = auVar104._0_4_ * auVar90._0_4_;
      auVar35._8_4_ = auVar104._8_4_ * auVar90._8_4_;
      auVar35._12_4_ = auVar104._12_4_ * auVar90._12_4_;
      auVar35._16_4_ = auVar104._16_4_ * auVar90._16_4_;
      auVar35._20_4_ = auVar104._20_4_ * auVar90._20_4_;
      auVar35._24_4_ = auVar104._24_4_ * auVar90._24_4_;
      auVar35._28_4_ = auVar92._28_4_;
      auVar36._4_4_ = -auVar103._4_4_ * auVar90._4_4_;
      auVar36._0_4_ = -auVar103._0_4_ * auVar90._0_4_;
      auVar36._8_4_ = -auVar103._8_4_ * auVar90._8_4_;
      auVar36._12_4_ = -auVar103._12_4_ * auVar90._12_4_;
      auVar36._16_4_ = -fVar136 * auVar90._16_4_;
      auVar36._20_4_ = -fVar137 * auVar90._20_4_;
      auVar36._24_4_ = -fVar160 * auVar90._24_4_;
      auVar36._28_4_ = auVar91._28_4_;
      auVar90 = vmulps_avx512vl(auVar90,auVar84);
      auVar77 = vfmadd213ps_fma(auVar32,auVar87,auVar96);
      auVar83 = vfmadd213ps_fma(auVar33,auVar87,auVar88);
      auVar91 = vfmadd213ps_avx512vl(auVar94,auVar87,auVar100);
      auVar92 = vfmadd213ps_avx512vl(auVar35,ZEXT1632(auVar10),auVar89);
      auVar79 = vfnmadd213ps_fma(auVar32,auVar87,auVar96);
      auVar99 = ZEXT1632(auVar10);
      auVar82 = vfmadd213ps_fma(auVar36,auVar99,ZEXT1632(auVar9));
      auVar80 = vfnmadd213ps_fma(auVar33,auVar87,auVar88);
      auVar7 = vfmadd213ps_fma(auVar90,auVar99,auVar93);
      auVar95 = vfnmadd231ps_avx512vl(auVar100,auVar87,auVar94);
      auVar140 = vfnmadd213ps_fma(auVar35,auVar99,auVar89);
      auVar162 = vfnmadd213ps_fma(auVar36,auVar99,ZEXT1632(auVar9));
      auVar164 = vfnmadd231ps_fma(auVar93,ZEXT1632(auVar10),auVar90);
      auVar90 = vsubps_avx512vl(auVar92,ZEXT1632(auVar79));
      auVar94 = vsubps_avx(ZEXT1632(auVar82),ZEXT1632(auVar80));
      auVar93 = vsubps_avx512vl(ZEXT1632(auVar7),auVar95);
      auVar100 = vmulps_avx512vl(auVar94,auVar95);
      auVar8 = vfmsub231ps_fma(auVar100,ZEXT1632(auVar80),auVar93);
      auVar37._4_4_ = auVar79._4_4_ * auVar93._4_4_;
      auVar37._0_4_ = auVar79._0_4_ * auVar93._0_4_;
      auVar37._8_4_ = auVar79._8_4_ * auVar93._8_4_;
      auVar37._12_4_ = auVar79._12_4_ * auVar93._12_4_;
      auVar37._16_4_ = auVar93._16_4_ * 0.0;
      auVar37._20_4_ = auVar93._20_4_ * 0.0;
      auVar37._24_4_ = auVar93._24_4_ * 0.0;
      auVar37._28_4_ = auVar93._28_4_;
      auVar93 = vfmsub231ps_avx512vl(auVar37,auVar95,auVar90);
      auVar38._4_4_ = auVar80._4_4_ * auVar90._4_4_;
      auVar38._0_4_ = auVar80._0_4_ * auVar90._0_4_;
      auVar38._8_4_ = auVar80._8_4_ * auVar90._8_4_;
      auVar38._12_4_ = auVar80._12_4_ * auVar90._12_4_;
      auVar38._16_4_ = auVar90._16_4_ * 0.0;
      auVar38._20_4_ = auVar90._20_4_ * 0.0;
      auVar38._24_4_ = auVar90._24_4_ * 0.0;
      auVar38._28_4_ = auVar90._28_4_;
      auVar9 = vfmsub231ps_fma(auVar38,ZEXT1632(auVar79),auVar94);
      auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar84,auVar93);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar84,ZEXT1632(auVar8));
      auVar85 = ZEXT1632(auVar81);
      uVar67 = vcmpps_avx512vl(auVar94,auVar85,2);
      bVar65 = (byte)uVar67;
      fVar75 = (float)((uint)(bVar65 & 1) * auVar77._0_4_ |
                      (uint)!(bool)(bVar65 & 1) * auVar140._0_4_);
      bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
      fVar148 = (float)((uint)bVar14 * auVar77._4_4_ | (uint)!bVar14 * auVar140._4_4_);
      bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
      fVar125 = (float)((uint)bVar14 * auVar77._8_4_ | (uint)!bVar14 * auVar140._8_4_);
      bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
      fVar128 = (float)((uint)bVar14 * auVar77._12_4_ | (uint)!bVar14 * auVar140._12_4_);
      auVar100 = ZEXT1632(CONCAT412(fVar128,CONCAT48(fVar125,CONCAT44(fVar148,fVar75))));
      fVar76 = (float)((uint)(bVar65 & 1) * auVar83._0_4_ |
                      (uint)!(bool)(bVar65 & 1) * auVar162._0_4_);
      bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
      fVar124 = (float)((uint)bVar14 * auVar83._4_4_ | (uint)!bVar14 * auVar162._4_4_);
      bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
      fVar126 = (float)((uint)bVar14 * auVar83._8_4_ | (uint)!bVar14 * auVar162._8_4_);
      bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
      fVar129 = (float)((uint)bVar14 * auVar83._12_4_ | (uint)!bVar14 * auVar162._12_4_);
      auVar99 = ZEXT1632(CONCAT412(fVar129,CONCAT48(fVar126,CONCAT44(fVar124,fVar76))));
      auVar105._0_4_ =
           (float)((uint)(bVar65 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar164._0_4_);
      bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar105._4_4_ = (float)((uint)bVar14 * auVar91._4_4_ | (uint)!bVar14 * auVar164._4_4_);
      bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar105._8_4_ = (float)((uint)bVar14 * auVar91._8_4_ | (uint)!bVar14 * auVar164._8_4_);
      bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar105._12_4_ = (float)((uint)bVar14 * auVar91._12_4_ | (uint)!bVar14 * auVar164._12_4_);
      fVar159 = (float)((uint)((byte)(uVar67 >> 4) & 1) * auVar91._16_4_);
      auVar105._16_4_ = fVar159;
      fVar142 = (float)((uint)((byte)(uVar67 >> 5) & 1) * auVar91._20_4_);
      auVar105._20_4_ = fVar142;
      fVar135 = (float)((uint)((byte)(uVar67 >> 6) & 1) * auVar91._24_4_);
      auVar105._24_4_ = fVar135;
      iVar2 = (uint)(byte)(uVar67 >> 7) * auVar91._28_4_;
      auVar105._28_4_ = iVar2;
      auVar90 = vblendmps_avx512vl(ZEXT1632(auVar79),auVar92);
      auVar106._0_4_ = (uint)(bVar65 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar8._0_4_
      ;
      bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar106._4_4_ = (uint)bVar14 * auVar90._4_4_ | (uint)!bVar14 * auVar8._4_4_;
      bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar106._8_4_ = (uint)bVar14 * auVar90._8_4_ | (uint)!bVar14 * auVar8._8_4_;
      bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar106._12_4_ = (uint)bVar14 * auVar90._12_4_ | (uint)!bVar14 * auVar8._12_4_;
      auVar106._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * auVar90._16_4_;
      auVar106._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * auVar90._20_4_;
      auVar106._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * auVar90._24_4_;
      auVar106._28_4_ = (uint)(byte)(uVar67 >> 7) * auVar90._28_4_;
      auVar90 = vblendmps_avx512vl(ZEXT1632(auVar80),ZEXT1632(auVar82));
      auVar107._0_4_ =
           (float)((uint)(bVar65 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar83._0_4_);
      bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar107._4_4_ = (float)((uint)bVar14 * auVar90._4_4_ | (uint)!bVar14 * auVar83._4_4_);
      bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar107._8_4_ = (float)((uint)bVar14 * auVar90._8_4_ | (uint)!bVar14 * auVar83._8_4_);
      bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar107._12_4_ = (float)((uint)bVar14 * auVar90._12_4_ | (uint)!bVar14 * auVar83._12_4_);
      fVar137 = (float)((uint)((byte)(uVar67 >> 4) & 1) * auVar90._16_4_);
      auVar107._16_4_ = fVar137;
      fVar136 = (float)((uint)((byte)(uVar67 >> 5) & 1) * auVar90._20_4_);
      auVar107._20_4_ = fVar136;
      fVar160 = (float)((uint)((byte)(uVar67 >> 6) & 1) * auVar90._24_4_);
      auVar107._24_4_ = fVar160;
      auVar107._28_4_ = (uint)(byte)(uVar67 >> 7) * auVar90._28_4_;
      auVar90 = vblendmps_avx512vl(auVar95,ZEXT1632(auVar7));
      auVar108._0_4_ =
           (float)((uint)(bVar65 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar91._0_4_);
      bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar108._4_4_ = (float)((uint)bVar14 * auVar90._4_4_ | (uint)!bVar14 * auVar91._4_4_);
      bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar108._8_4_ = (float)((uint)bVar14 * auVar90._8_4_ | (uint)!bVar14 * auVar91._8_4_);
      bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar108._12_4_ = (float)((uint)bVar14 * auVar90._12_4_ | (uint)!bVar14 * auVar91._12_4_);
      bVar14 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar108._16_4_ = (float)((uint)bVar14 * auVar90._16_4_ | (uint)!bVar14 * auVar91._16_4_);
      bVar14 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar108._20_4_ = (float)((uint)bVar14 * auVar90._20_4_ | (uint)!bVar14 * auVar91._20_4_);
      bVar14 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar108._24_4_ = (float)((uint)bVar14 * auVar90._24_4_ | (uint)!bVar14 * auVar91._24_4_);
      bVar14 = SUB81(uVar67 >> 7,0);
      auVar108._28_4_ = (uint)bVar14 * auVar90._28_4_ | (uint)!bVar14 * auVar91._28_4_;
      auVar109._0_4_ =
           (uint)(bVar65 & 1) * (int)auVar79._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar92._0_4_;
      bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar109._4_4_ = (uint)bVar14 * (int)auVar79._4_4_ | (uint)!bVar14 * auVar92._4_4_;
      bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar109._8_4_ = (uint)bVar14 * (int)auVar79._8_4_ | (uint)!bVar14 * auVar92._8_4_;
      bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar109._12_4_ = (uint)bVar14 * (int)auVar79._12_4_ | (uint)!bVar14 * auVar92._12_4_;
      auVar109._16_4_ = (uint)!(bool)((byte)(uVar67 >> 4) & 1) * auVar92._16_4_;
      auVar109._20_4_ = (uint)!(bool)((byte)(uVar67 >> 5) & 1) * auVar92._20_4_;
      auVar109._24_4_ = (uint)!(bool)((byte)(uVar67 >> 6) & 1) * auVar92._24_4_;
      auVar109._28_4_ = (uint)!SUB81(uVar67 >> 7,0) * auVar92._28_4_;
      bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
      bVar16 = (bool)((byte)(uVar67 >> 2) & 1);
      bVar17 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar110._0_4_ = (uint)(bVar65 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar7._0_4_
      ;
      bVar15 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar110._4_4_ = (uint)bVar15 * auVar95._4_4_ | (uint)!bVar15 * auVar7._4_4_;
      bVar15 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar110._8_4_ = (uint)bVar15 * auVar95._8_4_ | (uint)!bVar15 * auVar7._8_4_;
      bVar15 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar110._12_4_ = (uint)bVar15 * auVar95._12_4_ | (uint)!bVar15 * auVar7._12_4_;
      auVar110._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * auVar95._16_4_;
      auVar110._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * auVar95._20_4_;
      auVar110._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * auVar95._24_4_;
      iVar3 = (uint)(byte)(uVar67 >> 7) * auVar95._28_4_;
      auVar110._28_4_ = iVar3;
      auVar96 = vsubps_avx512vl(auVar109,auVar100);
      auVar90 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar80._12_4_ |
                                              (uint)!bVar17 * auVar82._12_4_,
                                              CONCAT48((uint)bVar16 * (int)auVar80._8_4_ |
                                                       (uint)!bVar16 * auVar82._8_4_,
                                                       CONCAT44((uint)bVar14 * (int)auVar80._4_4_ |
                                                                (uint)!bVar14 * auVar82._4_4_,
                                                                (uint)(bVar65 & 1) *
                                                                (int)auVar80._0_4_ |
                                                                (uint)!(bool)(bVar65 & 1) *
                                                                auVar82._0_4_)))),auVar99);
      auVar91 = vsubps_avx(auVar110,auVar105);
      auVar92 = vsubps_avx(auVar100,auVar106);
      auVar95 = vsubps_avx(auVar99,auVar107);
      auVar93 = vsubps_avx(auVar105,auVar108);
      auVar39._4_4_ = auVar91._4_4_ * fVar148;
      auVar39._0_4_ = auVar91._0_4_ * fVar75;
      auVar39._8_4_ = auVar91._8_4_ * fVar125;
      auVar39._12_4_ = auVar91._12_4_ * fVar128;
      auVar39._16_4_ = auVar91._16_4_ * 0.0;
      auVar39._20_4_ = auVar91._20_4_ * 0.0;
      auVar39._24_4_ = auVar91._24_4_ * 0.0;
      auVar39._28_4_ = iVar3;
      auVar77 = vfmsub231ps_fma(auVar39,auVar105,auVar96);
      auVar40._4_4_ = fVar124 * auVar96._4_4_;
      auVar40._0_4_ = fVar76 * auVar96._0_4_;
      auVar40._8_4_ = fVar126 * auVar96._8_4_;
      auVar40._12_4_ = fVar129 * auVar96._12_4_;
      auVar40._16_4_ = auVar96._16_4_ * 0.0;
      auVar40._20_4_ = auVar96._20_4_ * 0.0;
      auVar40._24_4_ = auVar96._24_4_ * 0.0;
      auVar40._28_4_ = auVar94._28_4_;
      auVar83 = vfmsub231ps_fma(auVar40,auVar100,auVar90);
      auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar85,ZEXT1632(auVar77));
      auVar155._0_4_ = auVar90._0_4_ * auVar105._0_4_;
      auVar155._4_4_ = auVar90._4_4_ * auVar105._4_4_;
      auVar155._8_4_ = auVar90._8_4_ * auVar105._8_4_;
      auVar155._12_4_ = auVar90._12_4_ * auVar105._12_4_;
      auVar155._16_4_ = auVar90._16_4_ * fVar159;
      auVar155._20_4_ = auVar90._20_4_ * fVar142;
      auVar155._24_4_ = auVar90._24_4_ * fVar135;
      auVar155._28_4_ = 0;
      auVar77 = vfmsub231ps_fma(auVar155,auVar99,auVar91);
      auVar88 = vfmadd231ps_avx512vl(auVar94,auVar85,ZEXT1632(auVar77));
      auVar94 = vmulps_avx512vl(auVar93,auVar106);
      auVar94 = vfmsub231ps_avx512vl(auVar94,auVar92,auVar108);
      auVar41._4_4_ = auVar95._4_4_ * auVar108._4_4_;
      auVar41._0_4_ = auVar95._0_4_ * auVar108._0_4_;
      auVar41._8_4_ = auVar95._8_4_ * auVar108._8_4_;
      auVar41._12_4_ = auVar95._12_4_ * auVar108._12_4_;
      auVar41._16_4_ = auVar95._16_4_ * auVar108._16_4_;
      auVar41._20_4_ = auVar95._20_4_ * auVar108._20_4_;
      auVar41._24_4_ = auVar95._24_4_ * auVar108._24_4_;
      auVar41._28_4_ = auVar108._28_4_;
      auVar77 = vfmsub231ps_fma(auVar41,auVar107,auVar93);
      auVar156._0_4_ = auVar107._0_4_ * auVar92._0_4_;
      auVar156._4_4_ = auVar107._4_4_ * auVar92._4_4_;
      auVar156._8_4_ = auVar107._8_4_ * auVar92._8_4_;
      auVar156._12_4_ = auVar107._12_4_ * auVar92._12_4_;
      auVar156._16_4_ = fVar137 * auVar92._16_4_;
      auVar156._20_4_ = fVar136 * auVar92._20_4_;
      auVar156._24_4_ = fVar160 * auVar92._24_4_;
      auVar156._28_4_ = 0;
      auVar83 = vfmsub231ps_fma(auVar156,auVar95,auVar106);
      auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar85,auVar94);
      auVar89 = vfmadd231ps_avx512vl(auVar94,auVar85,ZEXT1632(auVar77));
      auVar94 = vmaxps_avx(auVar88,auVar89);
      uVar138 = vcmpps_avx512vl(auVar94,auVar85,2);
      bVar74 = bVar74 & (byte)uVar138;
      auVar176 = ZEXT3264(local_340);
      auVar174 = ZEXT3264(local_360);
      auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar180 = ZEXT3264(auVar84);
      auVar175 = ZEXT3264(local_380);
      auVar172 = ZEXT3264(local_400);
      auVar181 = ZEXT3264(local_480);
      auVar179 = ZEXT3264(local_4c0);
      local_450 = auVar11;
      local_440 = auVar139;
      if (bVar74 != 0) {
        auVar42._4_4_ = auVar93._4_4_ * auVar90._4_4_;
        auVar42._0_4_ = auVar93._0_4_ * auVar90._0_4_;
        auVar42._8_4_ = auVar93._8_4_ * auVar90._8_4_;
        auVar42._12_4_ = auVar93._12_4_ * auVar90._12_4_;
        auVar42._16_4_ = auVar93._16_4_ * auVar90._16_4_;
        auVar42._20_4_ = auVar93._20_4_ * auVar90._20_4_;
        auVar42._24_4_ = auVar93._24_4_ * auVar90._24_4_;
        auVar42._28_4_ = auVar94._28_4_;
        auVar82 = vfmsub231ps_fma(auVar42,auVar95,auVar91);
        auVar43._4_4_ = auVar91._4_4_ * auVar92._4_4_;
        auVar43._0_4_ = auVar91._0_4_ * auVar92._0_4_;
        auVar43._8_4_ = auVar91._8_4_ * auVar92._8_4_;
        auVar43._12_4_ = auVar91._12_4_ * auVar92._12_4_;
        auVar43._16_4_ = auVar91._16_4_ * auVar92._16_4_;
        auVar43._20_4_ = auVar91._20_4_ * auVar92._20_4_;
        auVar43._24_4_ = auVar91._24_4_ * auVar92._24_4_;
        auVar43._28_4_ = auVar91._28_4_;
        auVar83 = vfmsub231ps_fma(auVar43,auVar96,auVar93);
        auVar44._4_4_ = auVar95._4_4_ * auVar96._4_4_;
        auVar44._0_4_ = auVar95._0_4_ * auVar96._0_4_;
        auVar44._8_4_ = auVar95._8_4_ * auVar96._8_4_;
        auVar44._12_4_ = auVar95._12_4_ * auVar96._12_4_;
        auVar44._16_4_ = auVar95._16_4_ * auVar96._16_4_;
        auVar44._20_4_ = auVar95._20_4_ * auVar96._20_4_;
        auVar44._24_4_ = auVar95._24_4_ * auVar96._24_4_;
        auVar44._28_4_ = auVar95._28_4_;
        auVar7 = vfmsub231ps_fma(auVar44,auVar92,auVar90);
        auVar77 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar83),ZEXT1632(auVar7));
        auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),ZEXT1632(auVar82),auVar85);
        auVar94 = vrcp14ps_avx512vl(auVar90);
        auVar91 = vfnmadd213ps_avx512vl(auVar94,auVar90,auVar84);
        auVar77 = vfmadd132ps_fma(auVar91,auVar94,auVar94);
        auVar45._4_4_ = auVar7._4_4_ * auVar105._4_4_;
        auVar45._0_4_ = auVar7._0_4_ * auVar105._0_4_;
        auVar45._8_4_ = auVar7._8_4_ * auVar105._8_4_;
        auVar45._12_4_ = auVar7._12_4_ * auVar105._12_4_;
        auVar45._16_4_ = fVar159 * 0.0;
        auVar45._20_4_ = fVar142 * 0.0;
        auVar45._24_4_ = fVar135 * 0.0;
        auVar45._28_4_ = iVar2;
        auVar83 = vfmadd231ps_fma(auVar45,auVar99,ZEXT1632(auVar83));
        auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar100,ZEXT1632(auVar82));
        fVar142 = auVar77._0_4_;
        fVar135 = auVar77._4_4_;
        fVar136 = auVar77._8_4_;
        fVar137 = auVar77._12_4_;
        local_240 = ZEXT1632(CONCAT412(auVar83._12_4_ * fVar137,
                                       CONCAT48(auVar83._8_4_ * fVar136,
                                                CONCAT44(auVar83._4_4_ * fVar135,
                                                         auVar83._0_4_ * fVar142))));
        auVar161._8_4_ = 3;
        auVar161._0_8_ = 0x300000003;
        auVar161._12_4_ = 3;
        auVar161._16_4_ = 3;
        auVar161._20_4_ = 3;
        auVar161._24_4_ = 3;
        auVar161._28_4_ = 3;
        auVar94 = vpermps_avx2(auVar161,ZEXT1632((undefined1  [16])aVar4));
        uVar138 = vcmpps_avx512vl(auVar94,local_240,2);
        fVar159 = local_558->tfar;
        auVar23._4_4_ = fVar159;
        auVar23._0_4_ = fVar159;
        auVar23._8_4_ = fVar159;
        auVar23._12_4_ = fVar159;
        auVar23._16_4_ = fVar159;
        auVar23._20_4_ = fVar159;
        auVar23._24_4_ = fVar159;
        auVar23._28_4_ = fVar159;
        uVar20 = vcmpps_avx512vl(local_240,auVar23,2);
        bVar74 = (byte)uVar138 & (byte)uVar20 & bVar74;
        if (bVar74 != 0) {
          uVar138 = vcmpps_avx512vl(auVar90,auVar85,4);
          bVar74 = bVar74 & (byte)uVar138;
          if (bVar74 != 0) {
            fVar159 = auVar88._0_4_ * fVar142;
            fVar160 = auVar88._4_4_ * fVar135;
            auVar46._4_4_ = fVar160;
            auVar46._0_4_ = fVar159;
            fVar75 = auVar88._8_4_ * fVar136;
            auVar46._8_4_ = fVar75;
            fVar76 = auVar88._12_4_ * fVar137;
            auVar46._12_4_ = fVar76;
            fVar148 = auVar88._16_4_ * 0.0;
            auVar46._16_4_ = fVar148;
            fVar124 = auVar88._20_4_ * 0.0;
            auVar46._20_4_ = fVar124;
            fVar125 = auVar88._24_4_ * 0.0;
            auVar46._24_4_ = fVar125;
            auVar46._28_4_ = auVar90._28_4_;
            auVar94 = vsubps_avx512vl(auVar84,auVar46);
            local_280._0_4_ =
                 (float)((uint)(bVar65 & 1) * (int)fVar159 |
                        (uint)!(bool)(bVar65 & 1) * auVar94._0_4_);
            bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
            local_280._4_4_ = (float)((uint)bVar14 * (int)fVar160 | (uint)!bVar14 * auVar94._4_4_);
            bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
            local_280._8_4_ = (float)((uint)bVar14 * (int)fVar75 | (uint)!bVar14 * auVar94._8_4_);
            bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
            local_280._12_4_ = (float)((uint)bVar14 * (int)fVar76 | (uint)!bVar14 * auVar94._12_4_);
            bVar14 = (bool)((byte)(uVar67 >> 4) & 1);
            local_280._16_4_ = (float)((uint)bVar14 * (int)fVar148 | (uint)!bVar14 * auVar94._16_4_)
            ;
            bVar14 = (bool)((byte)(uVar67 >> 5) & 1);
            local_280._20_4_ = (float)((uint)bVar14 * (int)fVar124 | (uint)!bVar14 * auVar94._20_4_)
            ;
            bVar14 = (bool)((byte)(uVar67 >> 6) & 1);
            local_280._24_4_ = (float)((uint)bVar14 * (int)fVar125 | (uint)!bVar14 * auVar94._24_4_)
            ;
            bVar14 = SUB81(uVar67 >> 7,0);
            local_280._28_4_ =
                 (float)((uint)bVar14 * auVar90._28_4_ | (uint)!bVar14 * auVar94._28_4_);
            auVar94 = vsubps_avx(ZEXT1632(auVar10),auVar87);
            auVar77 = vfmadd213ps_fma(auVar94,local_280,auVar87);
            fVar159 = local_568->depth_scale;
            auVar24._4_4_ = fVar159;
            auVar24._0_4_ = fVar159;
            auVar24._8_4_ = fVar159;
            auVar24._12_4_ = fVar159;
            auVar24._16_4_ = fVar159;
            auVar24._20_4_ = fVar159;
            auVar24._24_4_ = fVar159;
            auVar24._28_4_ = fVar159;
            auVar94 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar77._12_4_ + auVar77._12_4_,
                                                         CONCAT48(auVar77._8_4_ + auVar77._8_4_,
                                                                  CONCAT44(auVar77._4_4_ +
                                                                           auVar77._4_4_,
                                                                           auVar77._0_4_ +
                                                                           auVar77._0_4_)))),auVar24
                                     );
            uVar138 = vcmpps_avx512vl(local_240,auVar94,6);
            if (((byte)uVar138 & bVar74) != 0) {
              auVar149._0_4_ = auVar89._0_4_ * fVar142;
              auVar149._4_4_ = auVar89._4_4_ * fVar135;
              auVar149._8_4_ = auVar89._8_4_ * fVar136;
              auVar149._12_4_ = auVar89._12_4_ * fVar137;
              auVar149._16_4_ = auVar89._16_4_ * 0.0;
              auVar149._20_4_ = auVar89._20_4_ * 0.0;
              auVar149._24_4_ = auVar89._24_4_ * 0.0;
              auVar149._28_4_ = 0;
              auVar94 = vsubps_avx512vl(auVar84,auVar149);
              auVar111._0_4_ =
                   (uint)(bVar65 & 1) * (int)auVar149._0_4_ |
                   (uint)!(bool)(bVar65 & 1) * auVar94._0_4_;
              bVar14 = (bool)((byte)(uVar67 >> 1) & 1);
              auVar111._4_4_ = (uint)bVar14 * (int)auVar149._4_4_ | (uint)!bVar14 * auVar94._4_4_;
              bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
              auVar111._8_4_ = (uint)bVar14 * (int)auVar149._8_4_ | (uint)!bVar14 * auVar94._8_4_;
              bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
              auVar111._12_4_ = (uint)bVar14 * (int)auVar149._12_4_ | (uint)!bVar14 * auVar94._12_4_
              ;
              bVar14 = (bool)((byte)(uVar67 >> 4) & 1);
              auVar111._16_4_ = (uint)bVar14 * (int)auVar149._16_4_ | (uint)!bVar14 * auVar94._16_4_
              ;
              bVar14 = (bool)((byte)(uVar67 >> 5) & 1);
              auVar111._20_4_ = (uint)bVar14 * (int)auVar149._20_4_ | (uint)!bVar14 * auVar94._20_4_
              ;
              bVar14 = (bool)((byte)(uVar67 >> 6) & 1);
              auVar111._24_4_ = (uint)bVar14 * (int)auVar149._24_4_ | (uint)!bVar14 * auVar94._24_4_
              ;
              auVar111._28_4_ = (uint)!SUB81(uVar67 >> 7,0) * auVar94._28_4_;
              auVar25._8_4_ = 0x40000000;
              auVar25._0_8_ = 0x4000000040000000;
              auVar25._12_4_ = 0x40000000;
              auVar25._16_4_ = 0x40000000;
              auVar25._20_4_ = 0x40000000;
              auVar25._24_4_ = 0x40000000;
              auVar25._28_4_ = 0x40000000;
              local_260 = vfmsub132ps_avx512vl(auVar111,auVar84,auVar25);
              local_220 = 0;
              local_21c = iVar12;
              local_210 = local_430;
              local_200 = local_440._0_8_;
              uStack_1f8 = local_440._8_8_;
              local_1f0 = local_450._0_8_;
              uStack_1e8 = local_450._8_8_;
              if ((pGVar13->mask & local_558->mask) != 0) {
                if ((local_550->args->filter == (RTCFilterFunctionN)0x0) &&
                   (uVar67 = CONCAT71((int7)((ulong)local_550->args >> 8),1),
                   pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_019e7154;
                fVar159 = 1.0 / auVar167._0_4_;
                local_1c0[0] = fVar159 * (local_280._0_4_ + 0.0);
                local_1c0[1] = fVar159 * (local_280._4_4_ + 1.0);
                local_1c0[2] = fVar159 * (local_280._8_4_ + 2.0);
                local_1c0[3] = fVar159 * (local_280._12_4_ + 3.0);
                fStack_1b0 = fVar159 * (local_280._16_4_ + 4.0);
                fStack_1ac = fVar159 * (local_280._20_4_ + 5.0);
                fStack_1a8 = fVar159 * (local_280._24_4_ + 6.0);
                fStack_1a4 = local_280._28_4_ + 7.0;
                local_1a0 = local_260;
                local_180 = local_240;
                lVar72 = 0;
                uVar68 = (ulong)((byte)uVar138 & bVar74);
                for (uVar67 = uVar68; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000)
                {
                  lVar72 = lVar72 + 1;
                }
                local_460 = auVar78;
                while (auVar77 = auVar173._0_16_, auVar78 = local_460, uVar68 != 0) {
                  local_2a0._0_8_ = uVar68;
                  local_4f4 = local_1c0[lVar72];
                  local_4f0 = *(undefined4 *)(local_1a0 + lVar72 * 4);
                  local_2e0._0_4_ = local_558->tfar;
                  local_2c0._0_8_ = lVar72;
                  local_558->tfar = *(float *)(local_180 + lVar72 * 4);
                  local_530.context = local_550->user;
                  fVar159 = 1.0 - local_4f4;
                  auVar21._8_4_ = 0x80000000;
                  auVar21._0_8_ = 0x8000000080000000;
                  auVar21._12_4_ = 0x80000000;
                  auVar82 = vxorps_avx512vl(ZEXT416((uint)fVar159),auVar21);
                  auVar78 = ZEXT416((uint)(local_4f4 * fVar159 * 4.0));
                  auVar83 = vfnmsub213ss_fma(ZEXT416((uint)local_4f4),ZEXT416((uint)local_4f4),
                                             auVar78);
                  auVar78 = vfmadd213ss_fma(ZEXT416((uint)fVar159),ZEXT416((uint)fVar159),auVar78);
                  fVar159 = fVar159 * auVar82._0_4_ * 0.5;
                  fVar142 = auVar83._0_4_ * 0.5;
                  fVar135 = auVar78._0_4_ * 0.5;
                  fVar136 = local_4f4 * local_4f4 * 0.5;
                  auVar151._0_4_ = fVar136 * (float)local_310._0_4_;
                  auVar151._4_4_ = fVar136 * (float)local_310._4_4_;
                  auVar151._8_4_ = fVar136 * fStack_308;
                  auVar151._12_4_ = fVar136 * fStack_304;
                  auVar143._4_4_ = fVar135;
                  auVar143._0_4_ = fVar135;
                  auVar143._8_4_ = fVar135;
                  auVar143._12_4_ = fVar135;
                  auVar78 = vfmadd132ps_fma(auVar143,auVar151,local_450);
                  auVar152._4_4_ = fVar142;
                  auVar152._0_4_ = fVar142;
                  auVar152._8_4_ = fVar142;
                  auVar152._12_4_ = fVar142;
                  auVar78 = vfmadd132ps_fma(auVar152,auVar78,local_440);
                  auVar144._4_4_ = fVar159;
                  auVar144._0_4_ = fVar159;
                  auVar144._8_4_ = fVar159;
                  auVar144._12_4_ = fVar159;
                  auVar78 = vfmadd213ps_fma(auVar144,local_430,auVar78);
                  local_500 = vmovlps_avx(auVar78);
                  local_4f8 = vextractps_avx(auVar78,2);
                  local_4ec = local_544;
                  local_4e8 = (int)local_540;
                  local_4e4 = (local_530.context)->instID[0];
                  local_4e0 = (local_530.context)->instPrimID[0];
                  local_574 = -1;
                  local_530.valid = &local_574;
                  local_530.geometryUserPtr = pGVar13->userPtr;
                  local_530.ray = (RTCRayN *)local_558;
                  local_530.hit = (RTCHitN *)&local_500;
                  local_530.N = 1;
                  if ((pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar13->occlusionFilterN)(&local_530), *local_530.valid != 0)) {
                    p_Var69 = local_550->args->filter;
                    if ((p_Var69 == (RTCFilterFunctionN)0x0) ||
                       ((((local_550->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT &&
                         (((pGVar13->field_8).field_0x2 & 0x40) == 0)) ||
                        ((*p_Var69)(&local_530), p_Var69 = (RTCFilterFunctionN)local_530.valid,
                        *local_530.valid != 0)))) {
                      uVar67 = CONCAT71((int7)((ulong)p_Var69 >> 8),1);
                      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar180 = ZEXT3264(auVar94);
                      auVar78 = vxorps_avx512vl(auVar77,auVar77);
                      auVar173 = ZEXT1664(auVar78);
                      auVar176 = ZEXT3264(local_340);
                      auVar174 = ZEXT3264(local_360);
                      auVar175 = ZEXT3264(local_380);
                      auVar172 = ZEXT3264(local_400);
                      auVar181 = ZEXT3264(local_480);
                      auVar177 = ZEXT3264(local_4a0);
                      auVar178 = ZEXT3264(local_420);
                      auVar179 = ZEXT3264(local_4c0);
                      auVar78 = local_460;
                      goto LAB_019e7154;
                    }
                  }
                  local_558->tfar = (float)local_2e0._0_4_;
                  lVar72 = 0;
                  uVar68 = local_2a0._0_8_ ^ 1L << (local_2c0._0_8_ & 0x3f);
                  for (uVar67 = uVar68; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000
                      ) {
                    lVar72 = lVar72 + 1;
                  }
                  auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar180 = ZEXT3264(auVar94);
                  auVar78 = vxorps_avx512vl(auVar77,auVar77);
                  auVar173 = ZEXT1664(auVar78);
                  auVar176 = ZEXT3264(local_340);
                  auVar174 = ZEXT3264(local_360);
                  auVar175 = ZEXT3264(local_380);
                  auVar172 = ZEXT3264(local_400);
                  auVar181 = ZEXT3264(local_480);
                  auVar177 = ZEXT3264(local_4a0);
                  auVar178 = ZEXT3264(local_420);
                  auVar179 = ZEXT3264(local_4c0);
                }
              }
            }
          }
        }
      }
      uVar67 = 0;
    }
LAB_019e7154:
    if (8 < iVar12) {
      local_2a0 = vpbroadcastd_avx512vl();
      local_2c0 = vbroadcastss_avx512vl(auVar78);
      auVar134._8_4_ = 3;
      auVar134._0_8_ = 0x300000003;
      auVar134._12_4_ = 3;
      auVar134._16_4_ = 3;
      auVar134._20_4_ = 3;
      auVar134._24_4_ = 3;
      auVar134._28_4_ = 3;
      local_2e0 = vpermps_avx2(auVar134,local_3e0);
      local_300._4_4_ = 1.0 / (float)local_300._0_4_;
      local_300._0_4_ = local_300._4_4_;
      fStack_2f8 = (float)local_300._4_4_;
      fStack_2f4 = (float)local_300._4_4_;
      fStack_2f0 = (float)local_300._4_4_;
      fStack_2ec = (float)local_300._4_4_;
      fStack_2e8 = (float)local_300._4_4_;
      fStack_2e4 = (float)local_300._4_4_;
      local_400 = auVar172._0_32_;
      local_420 = auVar178._0_32_;
      for (lVar72 = 8; lVar72 < local_570; lVar72 = lVar72 + 8) {
        local_3e0._0_4_ = (int)uVar67;
        auVar94 = vpbroadcastd_avx512vl();
        auVar95 = vpor_avx2(auVar94,_DAT_01fb4ba0);
        uVar20 = vpcmpd_avx512vl(auVar95,local_2a0,1);
        auVar94 = *(undefined1 (*) [32])(bspline_basis0 + lVar72 * 4 + lVar71);
        auVar90 = *(undefined1 (*) [32])(lVar71 + 0x21fffac + lVar72 * 4);
        auVar91 = *(undefined1 (*) [32])(lVar71 + 0x2200430 + lVar72 * 4);
        auVar92 = *(undefined1 (*) [32])(lVar71 + 0x22008b4 + lVar72 * 4);
        auVar84 = auVar178._0_32_;
        auVar93 = vmulps_avx512vl(auVar84,auVar92);
        auVar169 = auVar179._0_32_;
        auVar100 = vmulps_avx512vl(auVar169,auVar92);
        auVar47._4_4_ = auVar92._4_4_ * (float)local_100._4_4_;
        auVar47._0_4_ = auVar92._0_4_ * (float)local_100._0_4_;
        auVar47._8_4_ = auVar92._8_4_ * fStack_f8;
        auVar47._12_4_ = auVar92._12_4_ * fStack_f4;
        auVar47._16_4_ = auVar92._16_4_ * fStack_f0;
        auVar47._20_4_ = auVar92._20_4_ * fStack_ec;
        auVar47._24_4_ = auVar92._24_4_ * fStack_e8;
        auVar47._28_4_ = auVar95._28_4_;
        auVar133 = auVar181._0_32_;
        auVar95 = vfmadd231ps_avx512vl(auVar93,auVar91,auVar133);
        auVar168 = auVar177._0_32_;
        auVar93 = vfmadd231ps_avx512vl(auVar100,auVar91,auVar168);
        auVar100 = vfmadd231ps_avx512vl(auVar47,auVar91,local_e0);
        auVar163 = auVar175._0_32_;
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar90,auVar163);
        auVar89 = auVar172._0_32_;
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar90,auVar89);
        auVar78 = vfmadd231ps_fma(auVar100,auVar90,local_c0);
        local_340 = auVar176._0_32_;
        auVar85 = vfmadd231ps_avx512vl(auVar95,auVar94,local_340);
        local_360 = auVar174._0_32_;
        auVar86 = vfmadd231ps_avx512vl(auVar93,auVar94,local_360);
        auVar95 = *(undefined1 (*) [32])(bspline_basis1 + lVar72 * 4 + lVar71);
        auVar93 = *(undefined1 (*) [32])(lVar71 + 0x22023cc + lVar72 * 4);
        auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar94,local_a0);
        auVar100 = *(undefined1 (*) [32])(lVar71 + 0x2202850 + lVar72 * 4);
        auVar99 = *(undefined1 (*) [32])(lVar71 + 0x2202cd4 + lVar72 * 4);
        auVar96 = vmulps_avx512vl(auVar84,auVar99);
        auVar88 = vmulps_avx512vl(auVar169,auVar99);
        auVar48._4_4_ = auVar99._4_4_ * (float)local_100._4_4_;
        auVar48._0_4_ = auVar99._0_4_ * (float)local_100._0_4_;
        auVar48._8_4_ = auVar99._8_4_ * fStack_f8;
        auVar48._12_4_ = auVar99._12_4_ * fStack_f4;
        auVar48._16_4_ = auVar99._16_4_ * fStack_f0;
        auVar48._20_4_ = auVar99._20_4_ * fStack_ec;
        auVar48._24_4_ = auVar99._24_4_ * fStack_e8;
        auVar48._28_4_ = uStack_e4;
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar100,auVar133);
        auVar88 = vfmadd231ps_avx512vl(auVar88,auVar100,auVar168);
        auVar87 = vfmadd231ps_avx512vl(auVar48,auVar100,local_e0);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar93,auVar163);
        auVar88 = vfmadd231ps_avx512vl(auVar88,auVar93,auVar89);
        auVar77 = vfmadd231ps_fma(auVar87,auVar93,local_c0);
        auVar87 = vfmadd231ps_avx512vl(auVar96,auVar95,local_340);
        auVar97 = vfmadd231ps_avx512vl(auVar88,auVar95,local_360);
        auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar95,local_a0);
        auVar98 = vmaxps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar77));
        auVar96 = vsubps_avx(auVar87,auVar85);
        auVar88 = vsubps_avx(auVar97,auVar86);
        auVar112 = vmulps_avx512vl(auVar86,auVar96);
        auVar113 = vmulps_avx512vl(auVar85,auVar88);
        auVar112 = vsubps_avx512vl(auVar112,auVar113);
        auVar113 = vmulps_avx512vl(auVar88,auVar88);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar96,auVar96);
        auVar98 = vmulps_avx512vl(auVar98,auVar98);
        auVar98 = vmulps_avx512vl(auVar98,auVar113);
        auVar112 = vmulps_avx512vl(auVar112,auVar112);
        uVar138 = vcmpps_avx512vl(auVar112,auVar98,2);
        bVar74 = (byte)uVar20 & (byte)uVar138;
        if (bVar74 == 0) {
LAB_019e7b2d:
          auVar178 = ZEXT3264(auVar84);
          auVar172 = ZEXT3264(auVar89);
          uVar67 = uVar67 & 0xffffffff;
        }
        else {
          auVar99 = vmulps_avx512vl(local_3c0,auVar99);
          auVar100 = vfmadd213ps_avx512vl(auVar100,local_160,auVar99);
          auVar93 = vfmadd213ps_avx512vl(auVar93,local_140,auVar100);
          auVar95 = vfmadd213ps_avx512vl(auVar95,local_120,auVar93);
          auVar92 = vmulps_avx512vl(local_3c0,auVar92);
          auVar91 = vfmadd213ps_avx512vl(auVar91,local_160,auVar92);
          auVar90 = vfmadd213ps_avx512vl(auVar90,local_140,auVar91);
          auVar93 = vfmadd213ps_avx512vl(auVar94,local_120,auVar90);
          auVar94 = *(undefined1 (*) [32])(lVar71 + 0x2200d38 + lVar72 * 4);
          auVar90 = *(undefined1 (*) [32])(lVar71 + 0x22011bc + lVar72 * 4);
          auVar91 = *(undefined1 (*) [32])(lVar71 + 0x2201640 + lVar72 * 4);
          auVar92 = *(undefined1 (*) [32])(lVar71 + 0x2201ac4 + lVar72 * 4);
          auVar100 = vmulps_avx512vl(auVar84,auVar92);
          auVar99 = vmulps_avx512vl(auVar169,auVar92);
          auVar92 = vmulps_avx512vl(local_3c0,auVar92);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar91,auVar133);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar91,auVar168);
          auVar91 = vfmadd231ps_avx512vl(auVar92,local_160,auVar91);
          auVar92 = vfmadd231ps_avx512vl(auVar100,auVar90,auVar163);
          auVar100 = vfmadd231ps_avx512vl(auVar99,auVar90,auVar89);
          auVar90 = vfmadd231ps_avx512vl(auVar91,local_140,auVar90);
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar94,local_340);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar94,local_360);
          auVar99 = vfmadd231ps_avx512vl(auVar90,local_120,auVar94);
          auVar94 = *(undefined1 (*) [32])(lVar71 + 0x2203158 + lVar72 * 4);
          auVar90 = *(undefined1 (*) [32])(lVar71 + 0x2203a60 + lVar72 * 4);
          auVar91 = *(undefined1 (*) [32])(lVar71 + 0x2203ee4 + lVar72 * 4);
          auVar84 = vmulps_avx512vl(auVar84,auVar91);
          auVar98 = vmulps_avx512vl(auVar169,auVar91);
          auVar91 = vmulps_avx512vl(local_3c0,auVar91);
          auVar84 = vfmadd231ps_avx512vl(auVar84,auVar90,auVar133);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar90,auVar168);
          auVar91 = vfmadd231ps_avx512vl(auVar91,local_160,auVar90);
          auVar90 = *(undefined1 (*) [32])(lVar71 + 0x22035dc + lVar72 * 4);
          auVar84 = vfmadd231ps_avx512vl(auVar84,auVar90,auVar163);
          auVar89 = vfmadd231ps_avx512vl(auVar98,auVar90,auVar89);
          auVar90 = vfmadd231ps_avx512vl(auVar91,local_140,auVar90);
          auVar91 = vfmadd231ps_avx512vl(auVar84,auVar94,local_340);
          auVar89 = vfmadd231ps_avx512vl(auVar89,auVar94,local_360);
          auVar90 = vfmadd231ps_avx512vl(auVar90,local_120,auVar94);
          auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar92,auVar84);
          vandps_avx512vl(auVar100,auVar84);
          auVar94 = vmaxps_avx(auVar84,auVar84);
          vandps_avx512vl(auVar99,auVar84);
          auVar94 = vmaxps_avx(auVar94,auVar84);
          uVar68 = vcmpps_avx512vl(auVar94,local_2c0,1);
          bVar14 = (bool)((byte)uVar68 & 1);
          auVar114._0_4_ = (float)((uint)bVar14 * auVar96._0_4_ | (uint)!bVar14 * auVar92._0_4_);
          bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
          auVar114._4_4_ = (float)((uint)bVar14 * auVar96._4_4_ | (uint)!bVar14 * auVar92._4_4_);
          bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
          auVar114._8_4_ = (float)((uint)bVar14 * auVar96._8_4_ | (uint)!bVar14 * auVar92._8_4_);
          bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar114._12_4_ = (float)((uint)bVar14 * auVar96._12_4_ | (uint)!bVar14 * auVar92._12_4_);
          bVar14 = (bool)((byte)(uVar68 >> 4) & 1);
          auVar114._16_4_ = (float)((uint)bVar14 * auVar96._16_4_ | (uint)!bVar14 * auVar92._16_4_);
          bVar14 = (bool)((byte)(uVar68 >> 5) & 1);
          auVar114._20_4_ = (float)((uint)bVar14 * auVar96._20_4_ | (uint)!bVar14 * auVar92._20_4_);
          bVar14 = (bool)((byte)(uVar68 >> 6) & 1);
          auVar114._24_4_ = (float)((uint)bVar14 * auVar96._24_4_ | (uint)!bVar14 * auVar92._24_4_);
          bVar14 = SUB81(uVar68 >> 7,0);
          auVar114._28_4_ = (uint)bVar14 * auVar96._28_4_ | (uint)!bVar14 * auVar92._28_4_;
          bVar14 = (bool)((byte)uVar68 & 1);
          auVar115._0_4_ = (float)((uint)bVar14 * auVar88._0_4_ | (uint)!bVar14 * auVar100._0_4_);
          bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
          auVar115._4_4_ = (float)((uint)bVar14 * auVar88._4_4_ | (uint)!bVar14 * auVar100._4_4_);
          bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
          auVar115._8_4_ = (float)((uint)bVar14 * auVar88._8_4_ | (uint)!bVar14 * auVar100._8_4_);
          bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar115._12_4_ = (float)((uint)bVar14 * auVar88._12_4_ | (uint)!bVar14 * auVar100._12_4_)
          ;
          bVar14 = (bool)((byte)(uVar68 >> 4) & 1);
          auVar115._16_4_ = (float)((uint)bVar14 * auVar88._16_4_ | (uint)!bVar14 * auVar100._16_4_)
          ;
          bVar14 = (bool)((byte)(uVar68 >> 5) & 1);
          auVar115._20_4_ = (float)((uint)bVar14 * auVar88._20_4_ | (uint)!bVar14 * auVar100._20_4_)
          ;
          bVar14 = (bool)((byte)(uVar68 >> 6) & 1);
          auVar115._24_4_ = (float)((uint)bVar14 * auVar88._24_4_ | (uint)!bVar14 * auVar100._24_4_)
          ;
          bVar14 = SUB81(uVar68 >> 7,0);
          auVar115._28_4_ = (uint)bVar14 * auVar88._28_4_ | (uint)!bVar14 * auVar100._28_4_;
          vandps_avx512vl(auVar91,auVar84);
          vandps_avx512vl(auVar89,auVar84);
          auVar94 = vmaxps_avx(auVar115,auVar115);
          vandps_avx512vl(auVar90,auVar84);
          auVar94 = vmaxps_avx(auVar94,auVar115);
          uVar68 = vcmpps_avx512vl(auVar94,local_2c0,1);
          bVar14 = (bool)((byte)uVar68 & 1);
          auVar116._0_4_ = (uint)bVar14 * auVar96._0_4_ | (uint)!bVar14 * auVar91._0_4_;
          bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
          auVar116._4_4_ = (uint)bVar14 * auVar96._4_4_ | (uint)!bVar14 * auVar91._4_4_;
          bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
          auVar116._8_4_ = (uint)bVar14 * auVar96._8_4_ | (uint)!bVar14 * auVar91._8_4_;
          bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar116._12_4_ = (uint)bVar14 * auVar96._12_4_ | (uint)!bVar14 * auVar91._12_4_;
          bVar14 = (bool)((byte)(uVar68 >> 4) & 1);
          auVar116._16_4_ = (uint)bVar14 * auVar96._16_4_ | (uint)!bVar14 * auVar91._16_4_;
          bVar14 = (bool)((byte)(uVar68 >> 5) & 1);
          auVar116._20_4_ = (uint)bVar14 * auVar96._20_4_ | (uint)!bVar14 * auVar91._20_4_;
          bVar14 = (bool)((byte)(uVar68 >> 6) & 1);
          auVar116._24_4_ = (uint)bVar14 * auVar96._24_4_ | (uint)!bVar14 * auVar91._24_4_;
          bVar14 = SUB81(uVar68 >> 7,0);
          auVar116._28_4_ = (uint)bVar14 * auVar96._28_4_ | (uint)!bVar14 * auVar91._28_4_;
          bVar14 = (bool)((byte)uVar68 & 1);
          auVar117._0_4_ = (float)((uint)bVar14 * auVar88._0_4_ | (uint)!bVar14 * auVar89._0_4_);
          bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
          auVar117._4_4_ = (float)((uint)bVar14 * auVar88._4_4_ | (uint)!bVar14 * auVar89._4_4_);
          bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
          auVar117._8_4_ = (float)((uint)bVar14 * auVar88._8_4_ | (uint)!bVar14 * auVar89._8_4_);
          bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar117._12_4_ = (float)((uint)bVar14 * auVar88._12_4_ | (uint)!bVar14 * auVar89._12_4_);
          bVar14 = (bool)((byte)(uVar68 >> 4) & 1);
          auVar117._16_4_ = (float)((uint)bVar14 * auVar88._16_4_ | (uint)!bVar14 * auVar89._16_4_);
          bVar14 = (bool)((byte)(uVar68 >> 5) & 1);
          auVar117._20_4_ = (float)((uint)bVar14 * auVar88._20_4_ | (uint)!bVar14 * auVar89._20_4_);
          bVar14 = (bool)((byte)(uVar68 >> 6) & 1);
          auVar117._24_4_ = (float)((uint)bVar14 * auVar88._24_4_ | (uint)!bVar14 * auVar89._24_4_);
          bVar14 = SUB81(uVar68 >> 7,0);
          auVar117._28_4_ = (uint)bVar14 * auVar88._28_4_ | (uint)!bVar14 * auVar89._28_4_;
          auVar165._8_4_ = 0x80000000;
          auVar165._0_8_ = 0x8000000080000000;
          auVar165._12_4_ = 0x80000000;
          auVar165._16_4_ = 0x80000000;
          auVar165._20_4_ = 0x80000000;
          auVar165._24_4_ = 0x80000000;
          auVar165._28_4_ = 0x80000000;
          auVar94 = vxorps_avx512vl(auVar116,auVar165);
          auVar98 = auVar173._0_32_;
          auVar90 = vfmadd213ps_avx512vl(auVar114,auVar114,auVar98);
          auVar83 = vfmadd231ps_fma(auVar90,auVar115,auVar115);
          auVar90 = vrsqrt14ps_avx512vl(ZEXT1632(auVar83));
          auVar171._8_4_ = 0xbf000000;
          auVar171._0_8_ = 0xbf000000bf000000;
          auVar171._12_4_ = 0xbf000000;
          auVar171._16_4_ = 0xbf000000;
          auVar171._20_4_ = 0xbf000000;
          auVar171._24_4_ = 0xbf000000;
          auVar171._28_4_ = 0xbf000000;
          fVar159 = auVar90._0_4_;
          fVar142 = auVar90._4_4_;
          fVar135 = auVar90._8_4_;
          fVar136 = auVar90._12_4_;
          fVar137 = auVar90._16_4_;
          fVar160 = auVar90._20_4_;
          fVar75 = auVar90._24_4_;
          auVar49._4_4_ = fVar142 * fVar142 * fVar142 * auVar83._4_4_ * -0.5;
          auVar49._0_4_ = fVar159 * fVar159 * fVar159 * auVar83._0_4_ * -0.5;
          auVar49._8_4_ = fVar135 * fVar135 * fVar135 * auVar83._8_4_ * -0.5;
          auVar49._12_4_ = fVar136 * fVar136 * fVar136 * auVar83._12_4_ * -0.5;
          auVar49._16_4_ = fVar137 * fVar137 * fVar137 * -0.0;
          auVar49._20_4_ = fVar160 * fVar160 * fVar160 * -0.0;
          auVar49._24_4_ = fVar75 * fVar75 * fVar75 * -0.0;
          auVar49._28_4_ = auVar115._28_4_;
          auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar90 = vfmadd231ps_avx512vl(auVar49,auVar91,auVar90);
          auVar50._4_4_ = auVar115._4_4_ * auVar90._4_4_;
          auVar50._0_4_ = auVar115._0_4_ * auVar90._0_4_;
          auVar50._8_4_ = auVar115._8_4_ * auVar90._8_4_;
          auVar50._12_4_ = auVar115._12_4_ * auVar90._12_4_;
          auVar50._16_4_ = auVar115._16_4_ * auVar90._16_4_;
          auVar50._20_4_ = auVar115._20_4_ * auVar90._20_4_;
          auVar50._24_4_ = auVar115._24_4_ * auVar90._24_4_;
          auVar50._28_4_ = 0;
          auVar51._4_4_ = auVar90._4_4_ * -auVar114._4_4_;
          auVar51._0_4_ = auVar90._0_4_ * -auVar114._0_4_;
          auVar51._8_4_ = auVar90._8_4_ * -auVar114._8_4_;
          auVar51._12_4_ = auVar90._12_4_ * -auVar114._12_4_;
          auVar51._16_4_ = auVar90._16_4_ * -auVar114._16_4_;
          auVar51._20_4_ = auVar90._20_4_ * -auVar114._20_4_;
          auVar51._24_4_ = auVar90._24_4_ * -auVar114._24_4_;
          auVar51._28_4_ = auVar115._28_4_;
          auVar92 = vmulps_avx512vl(auVar90,auVar98);
          auVar90 = vfmadd213ps_avx512vl(auVar116,auVar116,auVar98);
          auVar90 = vfmadd231ps_avx512vl(auVar90,auVar117,auVar117);
          auVar100 = vrsqrt14ps_avx512vl(auVar90);
          auVar90 = vmulps_avx512vl(auVar90,auVar171);
          fVar159 = auVar100._0_4_;
          fVar142 = auVar100._4_4_;
          fVar135 = auVar100._8_4_;
          fVar136 = auVar100._12_4_;
          fVar137 = auVar100._16_4_;
          fVar160 = auVar100._20_4_;
          fVar75 = auVar100._24_4_;
          auVar52._4_4_ = fVar142 * fVar142 * fVar142 * auVar90._4_4_;
          auVar52._0_4_ = fVar159 * fVar159 * fVar159 * auVar90._0_4_;
          auVar52._8_4_ = fVar135 * fVar135 * fVar135 * auVar90._8_4_;
          auVar52._12_4_ = fVar136 * fVar136 * fVar136 * auVar90._12_4_;
          auVar52._16_4_ = fVar137 * fVar137 * fVar137 * auVar90._16_4_;
          auVar52._20_4_ = fVar160 * fVar160 * fVar160 * auVar90._20_4_;
          auVar52._24_4_ = fVar75 * fVar75 * fVar75 * auVar90._24_4_;
          auVar52._28_4_ = auVar90._28_4_;
          auVar90 = vfmadd231ps_avx512vl(auVar52,auVar91,auVar100);
          auVar53._4_4_ = auVar117._4_4_ * auVar90._4_4_;
          auVar53._0_4_ = auVar117._0_4_ * auVar90._0_4_;
          auVar53._8_4_ = auVar117._8_4_ * auVar90._8_4_;
          auVar53._12_4_ = auVar117._12_4_ * auVar90._12_4_;
          auVar53._16_4_ = auVar117._16_4_ * auVar90._16_4_;
          auVar53._20_4_ = auVar117._20_4_ * auVar90._20_4_;
          auVar53._24_4_ = auVar117._24_4_ * auVar90._24_4_;
          auVar53._28_4_ = auVar100._28_4_;
          auVar54._4_4_ = auVar90._4_4_ * auVar94._4_4_;
          auVar54._0_4_ = auVar90._0_4_ * auVar94._0_4_;
          auVar54._8_4_ = auVar90._8_4_ * auVar94._8_4_;
          auVar54._12_4_ = auVar90._12_4_ * auVar94._12_4_;
          auVar54._16_4_ = auVar90._16_4_ * auVar94._16_4_;
          auVar54._20_4_ = auVar90._20_4_ * auVar94._20_4_;
          auVar54._24_4_ = auVar90._24_4_ * auVar94._24_4_;
          auVar54._28_4_ = auVar94._28_4_;
          auVar94 = vmulps_avx512vl(auVar90,auVar98);
          auVar83 = vfmadd213ps_fma(auVar50,ZEXT1632(auVar78),auVar85);
          auVar90 = ZEXT1632(auVar78);
          auVar82 = vfmadd213ps_fma(auVar51,auVar90,auVar86);
          auVar91 = vfmadd213ps_avx512vl(auVar92,auVar90,auVar93);
          auVar100 = vfmadd213ps_avx512vl(auVar53,ZEXT1632(auVar77),auVar87);
          auVar11 = vfnmadd213ps_fma(auVar50,auVar90,auVar85);
          auVar99 = ZEXT1632(auVar77);
          auVar7 = vfmadd213ps_fma(auVar54,auVar99,auVar97);
          auVar139 = vfnmadd213ps_fma(auVar51,auVar90,auVar86);
          auVar8 = vfmadd213ps_fma(auVar94,auVar99,auVar95);
          auVar84 = ZEXT1632(auVar78);
          auVar140 = vfnmadd231ps_fma(auVar93,auVar84,auVar92);
          auVar79 = vfnmadd213ps_fma(auVar53,auVar99,auVar87);
          auVar80 = vfnmadd213ps_fma(auVar54,auVar99,auVar97);
          auVar162 = vfnmadd231ps_fma(auVar95,ZEXT1632(auVar77),auVar94);
          auVar95 = vsubps_avx512vl(auVar100,ZEXT1632(auVar11));
          auVar94 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar139));
          auVar90 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar140));
          auVar55._4_4_ = auVar94._4_4_ * auVar140._4_4_;
          auVar55._0_4_ = auVar94._0_4_ * auVar140._0_4_;
          auVar55._8_4_ = auVar94._8_4_ * auVar140._8_4_;
          auVar55._12_4_ = auVar94._12_4_ * auVar140._12_4_;
          auVar55._16_4_ = auVar94._16_4_ * 0.0;
          auVar55._20_4_ = auVar94._20_4_ * 0.0;
          auVar55._24_4_ = auVar94._24_4_ * 0.0;
          auVar55._28_4_ = auVar92._28_4_;
          auVar78 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar139),auVar90);
          auVar56._4_4_ = auVar90._4_4_ * auVar11._4_4_;
          auVar56._0_4_ = auVar90._0_4_ * auVar11._0_4_;
          auVar56._8_4_ = auVar90._8_4_ * auVar11._8_4_;
          auVar56._12_4_ = auVar90._12_4_ * auVar11._12_4_;
          auVar56._16_4_ = auVar90._16_4_ * 0.0;
          auVar56._20_4_ = auVar90._20_4_ * 0.0;
          auVar56._24_4_ = auVar90._24_4_ * 0.0;
          auVar56._28_4_ = auVar90._28_4_;
          auVar9 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar140),auVar95);
          auVar57._4_4_ = auVar139._4_4_ * auVar95._4_4_;
          auVar57._0_4_ = auVar139._0_4_ * auVar95._0_4_;
          auVar57._8_4_ = auVar139._8_4_ * auVar95._8_4_;
          auVar57._12_4_ = auVar139._12_4_ * auVar95._12_4_;
          auVar57._16_4_ = auVar95._16_4_ * 0.0;
          auVar57._20_4_ = auVar95._20_4_ * 0.0;
          auVar57._24_4_ = auVar95._24_4_ * 0.0;
          auVar57._28_4_ = auVar95._28_4_;
          auVar10 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar11),auVar94);
          auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar98,ZEXT1632(auVar9));
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar98,ZEXT1632(auVar78));
          uVar68 = vcmpps_avx512vl(auVar94,auVar98,2);
          bVar65 = (byte)uVar68;
          fVar124 = (float)((uint)(bVar65 & 1) * auVar83._0_4_ |
                           (uint)!(bool)(bVar65 & 1) * auVar79._0_4_);
          bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
          fVar126 = (float)((uint)bVar14 * auVar83._4_4_ | (uint)!bVar14 * auVar79._4_4_);
          bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
          fVar129 = (float)((uint)bVar14 * auVar83._8_4_ | (uint)!bVar14 * auVar79._8_4_);
          bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
          fVar130 = (float)((uint)bVar14 * auVar83._12_4_ | (uint)!bVar14 * auVar79._12_4_);
          auVar99 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar129,CONCAT44(fVar126,fVar124))));
          fVar125 = (float)((uint)(bVar65 & 1) * auVar82._0_4_ |
                           (uint)!(bool)(bVar65 & 1) * auVar80._0_4_);
          bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
          fVar128 = (float)((uint)bVar14 * auVar82._4_4_ | (uint)!bVar14 * auVar80._4_4_);
          bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
          fVar127 = (float)((uint)bVar14 * auVar82._8_4_ | (uint)!bVar14 * auVar80._8_4_);
          bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
          fVar131 = (float)((uint)bVar14 * auVar82._12_4_ | (uint)!bVar14 * auVar80._12_4_);
          auVar96 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar127,CONCAT44(fVar128,fVar125))));
          auVar118._0_4_ =
               (float)((uint)(bVar65 & 1) * auVar91._0_4_ |
                      (uint)!(bool)(bVar65 & 1) * auVar162._0_4_);
          bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
          auVar118._4_4_ = (float)((uint)bVar14 * auVar91._4_4_ | (uint)!bVar14 * auVar162._4_4_);
          bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
          auVar118._8_4_ = (float)((uint)bVar14 * auVar91._8_4_ | (uint)!bVar14 * auVar162._8_4_);
          bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar118._12_4_ = (float)((uint)bVar14 * auVar91._12_4_ | (uint)!bVar14 * auVar162._12_4_)
          ;
          fVar159 = (float)((uint)((byte)(uVar68 >> 4) & 1) * auVar91._16_4_);
          auVar118._16_4_ = fVar159;
          fVar142 = (float)((uint)((byte)(uVar68 >> 5) & 1) * auVar91._20_4_);
          auVar118._20_4_ = fVar142;
          fVar135 = (float)((uint)((byte)(uVar68 >> 6) & 1) * auVar91._24_4_);
          auVar118._24_4_ = fVar135;
          iVar2 = (uint)(byte)(uVar68 >> 7) * auVar91._28_4_;
          auVar118._28_4_ = iVar2;
          auVar94 = vblendmps_avx512vl(ZEXT1632(auVar11),auVar100);
          auVar119._0_4_ =
               (uint)(bVar65 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar78._0_4_;
          bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
          auVar119._4_4_ = (uint)bVar14 * auVar94._4_4_ | (uint)!bVar14 * auVar78._4_4_;
          bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
          auVar119._8_4_ = (uint)bVar14 * auVar94._8_4_ | (uint)!bVar14 * auVar78._8_4_;
          bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar119._12_4_ = (uint)bVar14 * auVar94._12_4_ | (uint)!bVar14 * auVar78._12_4_;
          auVar119._16_4_ = (uint)((byte)(uVar68 >> 4) & 1) * auVar94._16_4_;
          auVar119._20_4_ = (uint)((byte)(uVar68 >> 5) & 1) * auVar94._20_4_;
          auVar119._24_4_ = (uint)((byte)(uVar68 >> 6) & 1) * auVar94._24_4_;
          auVar119._28_4_ = (uint)(byte)(uVar68 >> 7) * auVar94._28_4_;
          auVar94 = vblendmps_avx512vl(ZEXT1632(auVar139),ZEXT1632(auVar7));
          auVar120._0_4_ =
               (float)((uint)(bVar65 & 1) * auVar94._0_4_ |
                      (uint)!(bool)(bVar65 & 1) * auVar83._0_4_);
          bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar14 * auVar94._4_4_ | (uint)!bVar14 * auVar83._4_4_);
          bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar14 * auVar94._8_4_ | (uint)!bVar14 * auVar83._8_4_);
          bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar120._12_4_ = (float)((uint)bVar14 * auVar94._12_4_ | (uint)!bVar14 * auVar83._12_4_);
          fVar137 = (float)((uint)((byte)(uVar68 >> 4) & 1) * auVar94._16_4_);
          auVar120._16_4_ = fVar137;
          fVar160 = (float)((uint)((byte)(uVar68 >> 5) & 1) * auVar94._20_4_);
          auVar120._20_4_ = fVar160;
          fVar136 = (float)((uint)((byte)(uVar68 >> 6) & 1) * auVar94._24_4_);
          auVar120._24_4_ = fVar136;
          auVar120._28_4_ = (uint)(byte)(uVar68 >> 7) * auVar94._28_4_;
          auVar94 = vblendmps_avx512vl(ZEXT1632(auVar140),ZEXT1632(auVar8));
          auVar121._0_4_ =
               (float)((uint)(bVar65 & 1) * auVar94._0_4_ |
                      (uint)!(bool)(bVar65 & 1) * auVar82._0_4_);
          bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar14 * auVar94._4_4_ | (uint)!bVar14 * auVar82._4_4_);
          bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar14 * auVar94._8_4_ | (uint)!bVar14 * auVar82._8_4_);
          bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar121._12_4_ = (float)((uint)bVar14 * auVar94._12_4_ | (uint)!bVar14 * auVar82._12_4_);
          fVar148 = (float)((uint)((byte)(uVar68 >> 4) & 1) * auVar94._16_4_);
          auVar121._16_4_ = fVar148;
          fVar76 = (float)((uint)((byte)(uVar68 >> 5) & 1) * auVar94._20_4_);
          auVar121._20_4_ = fVar76;
          fVar75 = (float)((uint)((byte)(uVar68 >> 6) & 1) * auVar94._24_4_);
          auVar121._24_4_ = fVar75;
          iVar3 = (uint)(byte)(uVar68 >> 7) * auVar94._28_4_;
          auVar121._28_4_ = iVar3;
          auVar122._0_4_ =
               (uint)(bVar65 & 1) * (int)auVar11._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar100._0_4_;
          bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
          auVar122._4_4_ = (uint)bVar14 * (int)auVar11._4_4_ | (uint)!bVar14 * auVar100._4_4_;
          bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
          auVar122._8_4_ = (uint)bVar14 * (int)auVar11._8_4_ | (uint)!bVar14 * auVar100._8_4_;
          bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar122._12_4_ = (uint)bVar14 * (int)auVar11._12_4_ | (uint)!bVar14 * auVar100._12_4_;
          auVar122._16_4_ = (uint)!(bool)((byte)(uVar68 >> 4) & 1) * auVar100._16_4_;
          auVar122._20_4_ = (uint)!(bool)((byte)(uVar68 >> 5) & 1) * auVar100._20_4_;
          auVar122._24_4_ = (uint)!(bool)((byte)(uVar68 >> 6) & 1) * auVar100._24_4_;
          auVar122._28_4_ = (uint)!SUB81(uVar68 >> 7,0) * auVar100._28_4_;
          bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar68 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar68 >> 3) & 1);
          bVar15 = (bool)((byte)(uVar68 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar68 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar100 = vsubps_avx512vl(auVar122,auVar99);
          auVar90 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar139._12_4_ |
                                                  (uint)!bVar18 * auVar7._12_4_,
                                                  CONCAT48((uint)bVar16 * (int)auVar139._8_4_ |
                                                           (uint)!bVar16 * auVar7._8_4_,
                                                           CONCAT44((uint)bVar14 *
                                                                    (int)auVar139._4_4_ |
                                                                    (uint)!bVar14 * auVar7._4_4_,
                                                                    (uint)(bVar65 & 1) *
                                                                    (int)auVar139._0_4_ |
                                                                    (uint)!(bool)(bVar65 & 1) *
                                                                    auVar7._0_4_)))),auVar96);
          auVar91 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar140._12_4_ |
                                                  (uint)!bVar19 * auVar8._12_4_,
                                                  CONCAT48((uint)bVar17 * (int)auVar140._8_4_ |
                                                           (uint)!bVar17 * auVar8._8_4_,
                                                           CONCAT44((uint)bVar15 *
                                                                    (int)auVar140._4_4_ |
                                                                    (uint)!bVar15 * auVar8._4_4_,
                                                                    (uint)(bVar65 & 1) *
                                                                    (int)auVar140._0_4_ |
                                                                    (uint)!(bool)(bVar65 & 1) *
                                                                    auVar8._0_4_)))),auVar118);
          auVar92 = vsubps_avx(auVar99,auVar119);
          auVar95 = vsubps_avx(auVar96,auVar120);
          auVar93 = vsubps_avx(auVar118,auVar121);
          auVar58._4_4_ = auVar91._4_4_ * fVar126;
          auVar58._0_4_ = auVar91._0_4_ * fVar124;
          auVar58._8_4_ = auVar91._8_4_ * fVar129;
          auVar58._12_4_ = auVar91._12_4_ * fVar130;
          auVar58._16_4_ = auVar91._16_4_ * 0.0;
          auVar58._20_4_ = auVar91._20_4_ * 0.0;
          auVar58._24_4_ = auVar91._24_4_ * 0.0;
          auVar58._28_4_ = 0;
          auVar78 = vfmsub231ps_fma(auVar58,auVar118,auVar100);
          auVar150._0_4_ = fVar125 * auVar100._0_4_;
          auVar150._4_4_ = fVar128 * auVar100._4_4_;
          auVar150._8_4_ = fVar127 * auVar100._8_4_;
          auVar150._12_4_ = fVar131 * auVar100._12_4_;
          auVar150._16_4_ = auVar100._16_4_ * 0.0;
          auVar150._20_4_ = auVar100._20_4_ * 0.0;
          auVar150._24_4_ = auVar100._24_4_ * 0.0;
          auVar150._28_4_ = 0;
          auVar83 = vfmsub231ps_fma(auVar150,auVar99,auVar90);
          auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar98,ZEXT1632(auVar78));
          auVar157._0_4_ = auVar90._0_4_ * auVar118._0_4_;
          auVar157._4_4_ = auVar90._4_4_ * auVar118._4_4_;
          auVar157._8_4_ = auVar90._8_4_ * auVar118._8_4_;
          auVar157._12_4_ = auVar90._12_4_ * auVar118._12_4_;
          auVar157._16_4_ = auVar90._16_4_ * fVar159;
          auVar157._20_4_ = auVar90._20_4_ * fVar142;
          auVar157._24_4_ = auVar90._24_4_ * fVar135;
          auVar157._28_4_ = 0;
          auVar78 = vfmsub231ps_fma(auVar157,auVar96,auVar91);
          auVar88 = vfmadd231ps_avx512vl(auVar94,auVar98,ZEXT1632(auVar78));
          auVar94 = vmulps_avx512vl(auVar93,auVar119);
          auVar94 = vfmsub231ps_avx512vl(auVar94,auVar92,auVar121);
          auVar59._4_4_ = auVar95._4_4_ * auVar121._4_4_;
          auVar59._0_4_ = auVar95._0_4_ * auVar121._0_4_;
          auVar59._8_4_ = auVar95._8_4_ * auVar121._8_4_;
          auVar59._12_4_ = auVar95._12_4_ * auVar121._12_4_;
          auVar59._16_4_ = auVar95._16_4_ * fVar148;
          auVar59._20_4_ = auVar95._20_4_ * fVar76;
          auVar59._24_4_ = auVar95._24_4_ * fVar75;
          auVar59._28_4_ = iVar3;
          auVar78 = vfmsub231ps_fma(auVar59,auVar120,auVar93);
          auVar158._0_4_ = auVar120._0_4_ * auVar92._0_4_;
          auVar158._4_4_ = auVar120._4_4_ * auVar92._4_4_;
          auVar158._8_4_ = auVar120._8_4_ * auVar92._8_4_;
          auVar158._12_4_ = auVar120._12_4_ * auVar92._12_4_;
          auVar158._16_4_ = fVar137 * auVar92._16_4_;
          auVar158._20_4_ = fVar160 * auVar92._20_4_;
          auVar158._24_4_ = fVar136 * auVar92._24_4_;
          auVar158._28_4_ = 0;
          auVar83 = vfmsub231ps_fma(auVar158,auVar95,auVar119);
          auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar98,auVar94);
          auVar89 = vfmadd231ps_avx512vl(auVar94,auVar98,ZEXT1632(auVar78));
          auVar94 = vmaxps_avx(auVar88,auVar89);
          uVar138 = vcmpps_avx512vl(auVar94,auVar98,2);
          bVar74 = bVar74 & (byte)uVar138;
          if (bVar74 == 0) {
LAB_019e7b4c:
            auVar181 = ZEXT3264(local_480);
            auVar177 = ZEXT3264(local_4a0);
            auVar179 = ZEXT3264(local_4c0);
            auVar89 = local_400;
            auVar84 = local_420;
            goto LAB_019e7b2d;
          }
          auVar60._4_4_ = auVar93._4_4_ * auVar90._4_4_;
          auVar60._0_4_ = auVar93._0_4_ * auVar90._0_4_;
          auVar60._8_4_ = auVar93._8_4_ * auVar90._8_4_;
          auVar60._12_4_ = auVar93._12_4_ * auVar90._12_4_;
          auVar60._16_4_ = auVar93._16_4_ * auVar90._16_4_;
          auVar60._20_4_ = auVar93._20_4_ * auVar90._20_4_;
          auVar60._24_4_ = auVar93._24_4_ * auVar90._24_4_;
          auVar60._28_4_ = auVar94._28_4_;
          auVar82 = vfmsub231ps_fma(auVar60,auVar95,auVar91);
          auVar61._4_4_ = auVar91._4_4_ * auVar92._4_4_;
          auVar61._0_4_ = auVar91._0_4_ * auVar92._0_4_;
          auVar61._8_4_ = auVar91._8_4_ * auVar92._8_4_;
          auVar61._12_4_ = auVar91._12_4_ * auVar92._12_4_;
          auVar61._16_4_ = auVar91._16_4_ * auVar92._16_4_;
          auVar61._20_4_ = auVar91._20_4_ * auVar92._20_4_;
          auVar61._24_4_ = auVar91._24_4_ * auVar92._24_4_;
          auVar61._28_4_ = auVar91._28_4_;
          auVar83 = vfmsub231ps_fma(auVar61,auVar100,auVar93);
          auVar62._4_4_ = auVar95._4_4_ * auVar100._4_4_;
          auVar62._0_4_ = auVar95._0_4_ * auVar100._0_4_;
          auVar62._8_4_ = auVar95._8_4_ * auVar100._8_4_;
          auVar62._12_4_ = auVar95._12_4_ * auVar100._12_4_;
          auVar62._16_4_ = auVar95._16_4_ * auVar100._16_4_;
          auVar62._20_4_ = auVar95._20_4_ * auVar100._20_4_;
          auVar62._24_4_ = auVar95._24_4_ * auVar100._24_4_;
          auVar62._28_4_ = auVar95._28_4_;
          auVar7 = vfmsub231ps_fma(auVar62,auVar92,auVar90);
          auVar78 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar83),ZEXT1632(auVar7));
          auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar82),auVar98);
          auVar90 = vrcp14ps_avx512vl(auVar94);
          auVar92 = auVar180._0_32_;
          auVar91 = vfnmadd213ps_avx512vl(auVar90,auVar94,auVar92);
          auVar78 = vfmadd132ps_fma(auVar91,auVar90,auVar90);
          auVar63._4_4_ = auVar7._4_4_ * auVar118._4_4_;
          auVar63._0_4_ = auVar7._0_4_ * auVar118._0_4_;
          auVar63._8_4_ = auVar7._8_4_ * auVar118._8_4_;
          auVar63._12_4_ = auVar7._12_4_ * auVar118._12_4_;
          auVar63._16_4_ = fVar159 * 0.0;
          auVar63._20_4_ = fVar142 * 0.0;
          auVar63._24_4_ = fVar135 * 0.0;
          auVar63._28_4_ = iVar2;
          auVar83 = vfmadd231ps_fma(auVar63,auVar96,ZEXT1632(auVar83));
          auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar99,ZEXT1632(auVar82));
          fVar142 = auVar78._0_4_;
          fVar135 = auVar78._4_4_;
          fVar136 = auVar78._8_4_;
          fVar137 = auVar78._12_4_;
          local_240 = ZEXT1632(CONCAT412(auVar83._12_4_ * fVar137,
                                         CONCAT48(auVar83._8_4_ * fVar136,
                                                  CONCAT44(auVar83._4_4_ * fVar135,
                                                           auVar83._0_4_ * fVar142))));
          uVar138 = vcmpps_avx512vl(local_240,local_2e0,0xd);
          fVar159 = local_558->tfar;
          auVar27._4_4_ = fVar159;
          auVar27._0_4_ = fVar159;
          auVar27._8_4_ = fVar159;
          auVar27._12_4_ = fVar159;
          auVar27._16_4_ = fVar159;
          auVar27._20_4_ = fVar159;
          auVar27._24_4_ = fVar159;
          auVar27._28_4_ = fVar159;
          uVar20 = vcmpps_avx512vl(local_240,auVar27,2);
          bVar74 = (byte)uVar138 & (byte)uVar20 & bVar74;
          if (bVar74 == 0) goto LAB_019e7b4c;
          uVar138 = vcmpps_avx512vl(auVar94,auVar98,4);
          bVar74 = bVar74 & (byte)uVar138;
          auVar172 = ZEXT3264(local_400);
          auVar181 = ZEXT3264(local_480);
          auVar177 = ZEXT3264(local_4a0);
          auVar178 = ZEXT3264(local_420);
          auVar179 = ZEXT3264(local_4c0);
          uVar67 = uVar67 & 0xffffffff;
          if (bVar74 != 0) {
            fVar159 = auVar88._0_4_ * fVar142;
            fVar160 = auVar88._4_4_ * fVar135;
            auVar64._4_4_ = fVar160;
            auVar64._0_4_ = fVar159;
            fVar75 = auVar88._8_4_ * fVar136;
            auVar64._8_4_ = fVar75;
            fVar76 = auVar88._12_4_ * fVar137;
            auVar64._12_4_ = fVar76;
            fVar148 = auVar88._16_4_ * 0.0;
            auVar64._16_4_ = fVar148;
            fVar124 = auVar88._20_4_ * 0.0;
            auVar64._20_4_ = fVar124;
            fVar125 = auVar88._24_4_ * 0.0;
            auVar64._24_4_ = fVar125;
            auVar64._28_4_ = auVar94._28_4_;
            auVar90 = vsubps_avx512vl(auVar92,auVar64);
            local_280._0_4_ =
                 (float)((uint)(bVar65 & 1) * (int)fVar159 |
                        (uint)!(bool)(bVar65 & 1) * auVar90._0_4_);
            bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
            local_280._4_4_ = (float)((uint)bVar14 * (int)fVar160 | (uint)!bVar14 * auVar90._4_4_);
            bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
            local_280._8_4_ = (float)((uint)bVar14 * (int)fVar75 | (uint)!bVar14 * auVar90._8_4_);
            bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
            local_280._12_4_ = (float)((uint)bVar14 * (int)fVar76 | (uint)!bVar14 * auVar90._12_4_);
            bVar14 = (bool)((byte)(uVar68 >> 4) & 1);
            local_280._16_4_ = (float)((uint)bVar14 * (int)fVar148 | (uint)!bVar14 * auVar90._16_4_)
            ;
            bVar14 = (bool)((byte)(uVar68 >> 5) & 1);
            local_280._20_4_ = (float)((uint)bVar14 * (int)fVar124 | (uint)!bVar14 * auVar90._20_4_)
            ;
            bVar14 = (bool)((byte)(uVar68 >> 6) & 1);
            local_280._24_4_ = (float)((uint)bVar14 * (int)fVar125 | (uint)!bVar14 * auVar90._24_4_)
            ;
            bVar14 = SUB81(uVar68 >> 7,0);
            local_280._28_4_ =
                 (float)((uint)bVar14 * auVar94._28_4_ | (uint)!bVar14 * auVar90._28_4_);
            auVar94 = vsubps_avx(ZEXT1632(auVar77),auVar84);
            auVar78 = vfmadd213ps_fma(auVar94,local_280,auVar84);
            fVar159 = local_568->depth_scale;
            auVar28._4_4_ = fVar159;
            auVar28._0_4_ = fVar159;
            auVar28._8_4_ = fVar159;
            auVar28._12_4_ = fVar159;
            auVar28._16_4_ = fVar159;
            auVar28._20_4_ = fVar159;
            auVar28._24_4_ = fVar159;
            auVar28._28_4_ = fVar159;
            auVar94 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar78._12_4_ + auVar78._12_4_,
                                                         CONCAT48(auVar78._8_4_ + auVar78._8_4_,
                                                                  CONCAT44(auVar78._4_4_ +
                                                                           auVar78._4_4_,
                                                                           auVar78._0_4_ +
                                                                           auVar78._0_4_)))),auVar28
                                     );
            uVar138 = vcmpps_avx512vl(local_240,auVar94,6);
            if (((byte)uVar138 & bVar74) != 0) {
              auVar141._0_4_ = auVar89._0_4_ * fVar142;
              auVar141._4_4_ = auVar89._4_4_ * fVar135;
              auVar141._8_4_ = auVar89._8_4_ * fVar136;
              auVar141._12_4_ = auVar89._12_4_ * fVar137;
              auVar141._16_4_ = auVar89._16_4_ * 0.0;
              auVar141._20_4_ = auVar89._20_4_ * 0.0;
              auVar141._24_4_ = auVar89._24_4_ * 0.0;
              auVar141._28_4_ = 0;
              auVar94 = vsubps_avx512vl(auVar92,auVar141);
              auVar123._0_4_ =
                   (uint)(bVar65 & 1) * (int)auVar141._0_4_ |
                   (uint)!(bool)(bVar65 & 1) * auVar94._0_4_;
              bVar14 = (bool)((byte)(uVar68 >> 1) & 1);
              auVar123._4_4_ = (uint)bVar14 * (int)auVar141._4_4_ | (uint)!bVar14 * auVar94._4_4_;
              bVar14 = (bool)((byte)(uVar68 >> 2) & 1);
              auVar123._8_4_ = (uint)bVar14 * (int)auVar141._8_4_ | (uint)!bVar14 * auVar94._8_4_;
              bVar14 = (bool)((byte)(uVar68 >> 3) & 1);
              auVar123._12_4_ = (uint)bVar14 * (int)auVar141._12_4_ | (uint)!bVar14 * auVar94._12_4_
              ;
              bVar14 = (bool)((byte)(uVar68 >> 4) & 1);
              auVar123._16_4_ = (uint)bVar14 * (int)auVar141._16_4_ | (uint)!bVar14 * auVar94._16_4_
              ;
              bVar14 = (bool)((byte)(uVar68 >> 5) & 1);
              auVar123._20_4_ = (uint)bVar14 * (int)auVar141._20_4_ | (uint)!bVar14 * auVar94._20_4_
              ;
              bVar14 = (bool)((byte)(uVar68 >> 6) & 1);
              auVar123._24_4_ = (uint)bVar14 * (int)auVar141._24_4_ | (uint)!bVar14 * auVar94._24_4_
              ;
              auVar123._28_4_ = (uint)!SUB81(uVar68 >> 7,0) * auVar94._28_4_;
              auVar29._8_4_ = 0x40000000;
              auVar29._0_8_ = 0x4000000040000000;
              auVar29._12_4_ = 0x40000000;
              auVar29._16_4_ = 0x40000000;
              auVar29._20_4_ = 0x40000000;
              auVar29._24_4_ = 0x40000000;
              auVar29._28_4_ = 0x40000000;
              local_260 = vfmsub132ps_avx512vl(auVar123,auVar92,auVar29);
              local_220 = (int)lVar72;
              local_21c = iVar12;
              local_210 = local_430;
              local_200 = local_440._0_8_;
              uStack_1f8 = local_440._8_8_;
              local_1f0 = local_450._0_8_;
              uStack_1e8 = local_450._8_8_;
              pGVar13 = (local_550->scene->geometries).items[local_540].ptr;
              if ((pGVar13->mask & local_558->mask) == 0) {
                bVar65 = 0;
              }
              else if ((local_550->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar65 = 1, pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                local_4c8 = pGVar13;
                auVar78 = vcvtsi2ss_avx512f(auVar173._0_16_,(int)lVar72);
                fVar159 = auVar78._0_4_;
                local_1c0[0] = (fVar159 + local_280._0_4_ + 0.0) * (float)local_300._0_4_;
                local_1c0[1] = (fVar159 + local_280._4_4_ + 1.0) * (float)local_300._4_4_;
                local_1c0[2] = (fVar159 + local_280._8_4_ + 2.0) * fStack_2f8;
                local_1c0[3] = (fVar159 + local_280._12_4_ + 3.0) * fStack_2f4;
                fStack_1b0 = (fVar159 + local_280._16_4_ + 4.0) * fStack_2f0;
                fStack_1ac = (fVar159 + local_280._20_4_ + 5.0) * fStack_2ec;
                fStack_1a8 = (fVar159 + local_280._24_4_ + 6.0) * fStack_2e8;
                fStack_1a4 = fVar159 + local_280._28_4_ + 7.0;
                local_1a0 = local_260;
                local_180 = local_240;
                uVar67 = 0;
                uVar70 = (ulong)((byte)uVar138 & bVar74);
                for (uVar68 = uVar70; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000)
                {
                  uVar67 = uVar67 + 1;
                }
                while( true ) {
                  auVar78 = auVar173._0_16_;
                  local_460._0_8_ = uVar70;
                  if (uVar70 == 0) break;
                  local_4f4 = local_1c0[uVar67];
                  local_4f0 = *(undefined4 *)(local_1a0 + uVar67 * 4);
                  local_534 = local_558->tfar;
                  local_390 = uVar67;
                  local_558->tfar = *(float *)(local_180 + uVar67 * 4);
                  local_530.context = local_550->user;
                  fVar159 = 1.0 - local_4f4;
                  auVar22._8_4_ = 0x80000000;
                  auVar22._0_8_ = 0x8000000080000000;
                  auVar22._12_4_ = 0x80000000;
                  auVar83 = vxorps_avx512vl(ZEXT416((uint)fVar159),auVar22);
                  auVar78 = ZEXT416((uint)(local_4f4 * fVar159 * 4.0));
                  auVar77 = vfnmsub213ss_fma(ZEXT416((uint)local_4f4),ZEXT416((uint)local_4f4),
                                             auVar78);
                  auVar78 = vfmadd213ss_fma(ZEXT416((uint)fVar159),ZEXT416((uint)fVar159),auVar78);
                  fVar159 = fVar159 * auVar83._0_4_ * 0.5;
                  fVar142 = auVar77._0_4_ * 0.5;
                  fVar135 = auVar78._0_4_ * 0.5;
                  fVar136 = local_4f4 * local_4f4 * 0.5;
                  auVar153._0_4_ = fVar136 * (float)local_310._0_4_;
                  auVar153._4_4_ = fVar136 * (float)local_310._4_4_;
                  auVar153._8_4_ = fVar136 * fStack_308;
                  auVar153._12_4_ = fVar136 * fStack_304;
                  auVar145._4_4_ = fVar135;
                  auVar145._0_4_ = fVar135;
                  auVar145._8_4_ = fVar135;
                  auVar145._12_4_ = fVar135;
                  auVar78 = vfmadd132ps_fma(auVar145,auVar153,local_450);
                  auVar154._4_4_ = fVar142;
                  auVar154._0_4_ = fVar142;
                  auVar154._8_4_ = fVar142;
                  auVar154._12_4_ = fVar142;
                  auVar78 = vfmadd132ps_fma(auVar154,auVar78,local_440);
                  auVar146._4_4_ = fVar159;
                  auVar146._0_4_ = fVar159;
                  auVar146._8_4_ = fVar159;
                  auVar146._12_4_ = fVar159;
                  auVar78 = vfmadd213ps_fma(auVar146,local_430,auVar78);
                  local_500 = vmovlps_avx(auVar78);
                  local_4f8 = vextractps_avx(auVar78,2);
                  local_4ec = local_544;
                  local_4e8 = (int)local_540;
                  local_4e4 = (local_530.context)->instID[0];
                  local_4e0 = (local_530.context)->instPrimID[0];
                  local_574 = -1;
                  local_530.valid = &local_574;
                  local_530.geometryUserPtr = local_4c8->userPtr;
                  local_530.ray = (RTCRayN *)local_558;
                  local_530.hit = (RTCHitN *)&local_500;
                  local_530.N = 1;
                  if ((local_4c8->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*local_4c8->occlusionFilterN)(&local_530), *local_530.valid != 0)) {
                    auVar78 = auVar173._0_16_;
                    p_Var69 = local_550->args->filter;
                    if ((p_Var69 != (RTCFilterFunctionN)0x0) &&
                       (((local_550->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((local_4c8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var69)(&local_530);
                      auVar78 = auVar173._0_16_;
                      if (*local_530.valid == 0) goto LAB_019e7af3;
                    }
                    bVar65 = 1;
                    goto LAB_019e7b8b;
                  }
LAB_019e7af3:
                  local_558->tfar = local_534;
                  uVar67 = 0;
                  uVar70 = local_460._0_8_ ^ 1L << (local_390 & 0x3f);
                  for (uVar68 = uVar70; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000
                      ) {
                    uVar67 = uVar67 + 1;
                  }
                }
                bVar65 = 0;
LAB_019e7b8b:
                auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar180 = ZEXT3264(auVar94);
                auVar78 = vxorps_avx512vl(auVar78,auVar78);
                auVar173 = ZEXT1664(auVar78);
                auVar176 = ZEXT3264(local_340);
                auVar174 = ZEXT3264(local_360);
                auVar175 = ZEXT3264(local_380);
                auVar172 = ZEXT3264(local_400);
                auVar181 = ZEXT3264(local_480);
                auVar177 = ZEXT3264(local_4a0);
                auVar178 = ZEXT3264(local_420);
                auVar179 = ZEXT3264(local_4c0);
              }
              uVar67 = (ulong)CONCAT31(local_3e0._1_3_,local_3e0[0] | bVar65);
            }
          }
        }
      }
    }
    if ((uVar67 & 1) != 0) break;
    fVar159 = local_558->tfar;
    auVar26._4_4_ = fVar159;
    auVar26._0_4_ = fVar159;
    auVar26._8_4_ = fVar159;
    auVar26._12_4_ = fVar159;
    auVar26._16_4_ = fVar159;
    auVar26._20_4_ = fVar159;
    auVar26._24_4_ = fVar159;
    auVar26._28_4_ = fVar159;
    uVar138 = vcmpps_avx512vl(local_80,auVar26,2);
    local_388 = (ulong)((uint)uVar73 & (uint)uVar138);
  }
  return local_388 != 0;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }
          
          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }